

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiIntersectorK<8,16>::
     occluded_n<embree::avx512::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,16>,embree::avx512::Occluded1KEpilog1<16,true>>
               (Precalculations *pre,RayK<16> *ray,size_t k,RayQueryContext *context,Primitive *prim
               )

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  uint uVar7;
  Geometry *pGVar8;
  RTCFilterFunctionN p_Var9;
  void *pvVar10;
  __int_type_conflict _Var11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  bool bVar26;
  byte bVar27;
  uint uVar28;
  ulong uVar29;
  long lVar31;
  uint uVar32;
  ulong uVar33;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  ulong uVar34;
  undefined8 in_R10;
  ulong uVar35;
  ulong uVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  bool bVar41;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar92 [64];
  undefined1 auVar94 [64];
  undefined1 auVar59 [16];
  undefined1 auVar96 [64];
  undefined1 auVar98 [64];
  undefined1 auVar100 [64];
  undefined1 auVar102 [64];
  float fVar103;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  float fVar109;
  float fVar110;
  float fVar111;
  undefined1 auVar108 [64];
  float t1;
  undefined4 uVar112;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  float fVar120;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  float fVar132;
  float fVar133;
  float fVar134;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  vfloat4 b0;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  vfloat4 b0_1;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [32];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [32];
  vfloat4 a0_3;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [32];
  vfloat4 a0_2;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar179 [16];
  undefined1 auVar188 [32];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar208;
  float fVar210;
  float fVar212;
  undefined1 auVar199 [16];
  float fVar209;
  float fVar211;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  float fVar213;
  float fVar221;
  float fVar222;
  float fVar223;
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  vfloat4 a0;
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  vfloat4 a0_1;
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [32];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  undefined1 auVar246 [64];
  undefined1 auVar247 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  vint<16> mask;
  BBox1f cv_stack [4];
  uint auStack_630 [4];
  RTCFilterFunctionNArguments local_620;
  undefined1 local_5f0 [8];
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [16];
  undefined1 local_5d0 [16];
  undefined1 local_5c0 [16];
  undefined1 local_5b0 [8];
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  undefined1 local_590 [16];
  undefined1 local_580 [16];
  undefined1 local_570 [8];
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [16];
  undefined1 local_550 [8];
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [16];
  undefined1 local_530 [16];
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  undefined1 local_500 [16];
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  undefined1 local_490 [16];
  undefined1 local_480 [16];
  undefined1 local_470 [16];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined8 uStack_420;
  undefined1 local_400 [64];
  undefined1 local_3c0 [32];
  ulong auStack_3a0 [4];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  ulong uVar30;
  undefined1 auVar91 [64];
  undefined1 auVar93 [64];
  undefined1 auVar95 [64];
  undefined1 auVar97 [64];
  undefined1 auVar99 [64];
  undefined1 auVar101 [64];
  undefined1 auVar232 [32];
  
  uVar29 = (ulong)(byte)prim[1];
  fVar196 = *(float *)(prim + uVar29 * 0x19 + 0x12);
  auVar42 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar42 = vinsertps_avx(auVar42,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar54 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar45 = vinsertps_avx(auVar54,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar43 = vsubps_avx(auVar42,*(undefined1 (*) [16])(prim + uVar29 * 0x19 + 6));
  fVar120 = fVar196 * auVar43._0_4_;
  fVar103 = fVar196 * auVar45._0_4_;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = *(ulong *)(prim + uVar29 * 4 + 6);
  auVar74 = vpmovsxbd_avx2(auVar42);
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar54._8_8_ = 0;
  auVar54._0_8_ = *(ulong *)(prim + uVar29 * 5 + 6);
  auVar72 = vpmovsxbd_avx2(auVar54);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + uVar29 * 6 + 6);
  auVar73 = vpmovsxbd_avx2(auVar3);
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar53._8_8_ = 0;
  auVar53._0_8_ = *(ulong *)(prim + uVar29 * 0xb + 6);
  auVar84 = vpmovsxbd_avx2(auVar53);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = *(ulong *)(prim + uVar29 * 0xc + 6);
  auVar85 = vpmovsxbd_avx2(auVar52);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = *(ulong *)(prim + uVar29 * 0xd + 6);
  auVar75 = vpmovsxbd_avx2(auVar51);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar29 * 0x12 + 6);
  auVar76 = vpmovsxbd_avx2(auVar4);
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = *(ulong *)(prim + uVar29 * 0x13 + 6);
  auVar79 = vpmovsxbd_avx2(auVar50);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar29 * 0x14 + 6);
  auVar70 = vpmovsxbd_avx2(auVar5);
  auVar77 = vcvtdq2ps_avx(auVar79);
  auVar78 = vcvtdq2ps_avx(auVar70);
  auVar130._4_4_ = fVar103;
  auVar130._0_4_ = fVar103;
  auVar130._8_4_ = fVar103;
  auVar130._12_4_ = fVar103;
  auVar130._16_4_ = fVar103;
  auVar130._20_4_ = fVar103;
  auVar130._24_4_ = fVar103;
  auVar130._28_4_ = fVar103;
  auVar237._8_4_ = 1;
  auVar237._0_8_ = 0x100000001;
  auVar237._12_4_ = 1;
  auVar237._16_4_ = 1;
  auVar237._20_4_ = 1;
  auVar237._24_4_ = 1;
  auVar237._28_4_ = 1;
  auVar80 = ZEXT1632(CONCAT412(fVar196 * auVar45._12_4_,
                               CONCAT48(fVar196 * auVar45._8_4_,
                                        CONCAT44(fVar196 * auVar45._4_4_,fVar103))));
  auVar71 = vpermps_avx2(auVar237,auVar80);
  auVar68 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar244 = ZEXT3264(auVar68);
  auVar69 = vpermps_avx512vl(auVar68,auVar80);
  fVar103 = auVar69._0_4_;
  fVar198 = auVar69._4_4_;
  auVar80._4_4_ = fVar198 * auVar73._4_4_;
  auVar80._0_4_ = fVar103 * auVar73._0_4_;
  fVar209 = auVar69._8_4_;
  auVar80._8_4_ = fVar209 * auVar73._8_4_;
  fVar211 = auVar69._12_4_;
  auVar80._12_4_ = fVar211 * auVar73._12_4_;
  fVar109 = auVar69._16_4_;
  auVar80._16_4_ = fVar109 * auVar73._16_4_;
  fVar110 = auVar69._20_4_;
  auVar80._20_4_ = fVar110 * auVar73._20_4_;
  fVar111 = auVar69._24_4_;
  auVar80._24_4_ = fVar111 * auVar73._24_4_;
  auVar80._28_4_ = auVar70._28_4_;
  auVar70._4_4_ = auVar75._4_4_ * fVar198;
  auVar70._0_4_ = auVar75._0_4_ * fVar103;
  auVar70._8_4_ = auVar75._8_4_ * fVar209;
  auVar70._12_4_ = auVar75._12_4_ * fVar211;
  auVar70._16_4_ = auVar75._16_4_ * fVar109;
  auVar70._20_4_ = auVar75._20_4_ * fVar110;
  auVar70._24_4_ = auVar75._24_4_ * fVar111;
  auVar70._28_4_ = auVar79._28_4_;
  auVar79._4_4_ = auVar78._4_4_ * fVar198;
  auVar79._0_4_ = auVar78._0_4_ * fVar103;
  auVar79._8_4_ = auVar78._8_4_ * fVar209;
  auVar79._12_4_ = auVar78._12_4_ * fVar211;
  auVar79._16_4_ = auVar78._16_4_ * fVar109;
  auVar79._20_4_ = auVar78._20_4_ * fVar110;
  auVar79._24_4_ = auVar78._24_4_ * fVar111;
  auVar79._28_4_ = auVar69._28_4_;
  auVar42 = vfmadd231ps_fma(auVar80,auVar71,auVar72);
  auVar54 = vfmadd231ps_fma(auVar70,auVar71,auVar85);
  auVar3 = vfmadd231ps_fma(auVar79,auVar77,auVar71);
  auVar42 = vfmadd231ps_fma(ZEXT1632(auVar42),auVar130,auVar74);
  auVar54 = vfmadd231ps_fma(ZEXT1632(auVar54),auVar130,auVar84);
  auVar3 = vfmadd231ps_fma(ZEXT1632(auVar3),auVar76,auVar130);
  auVar142._4_4_ = fVar120;
  auVar142._0_4_ = fVar120;
  auVar142._8_4_ = fVar120;
  auVar142._12_4_ = fVar120;
  auVar142._16_4_ = fVar120;
  auVar142._20_4_ = fVar120;
  auVar142._24_4_ = fVar120;
  auVar142._28_4_ = fVar120;
  auVar70 = ZEXT1632(CONCAT412(fVar196 * auVar43._12_4_,
                               CONCAT48(fVar196 * auVar43._8_4_,
                                        CONCAT44(fVar196 * auVar43._4_4_,fVar120))));
  auVar79 = vpermps_avx2(auVar237,auVar70);
  auVar70 = vpermps_avx512vl(auVar68,auVar70);
  auVar71 = vmulps_avx512vl(auVar70,auVar73);
  auVar82._0_4_ = auVar70._0_4_ * auVar75._0_4_;
  auVar82._4_4_ = auVar70._4_4_ * auVar75._4_4_;
  auVar82._8_4_ = auVar70._8_4_ * auVar75._8_4_;
  auVar82._12_4_ = auVar70._12_4_ * auVar75._12_4_;
  auVar82._16_4_ = auVar70._16_4_ * auVar75._16_4_;
  auVar82._20_4_ = auVar70._20_4_ * auVar75._20_4_;
  auVar82._24_4_ = auVar70._24_4_ * auVar75._24_4_;
  auVar82._28_4_ = 0;
  auVar75._4_4_ = auVar70._4_4_ * auVar78._4_4_;
  auVar75._0_4_ = auVar70._0_4_ * auVar78._0_4_;
  auVar75._8_4_ = auVar70._8_4_ * auVar78._8_4_;
  auVar75._12_4_ = auVar70._12_4_ * auVar78._12_4_;
  auVar75._16_4_ = auVar70._16_4_ * auVar78._16_4_;
  auVar75._20_4_ = auVar70._20_4_ * auVar78._20_4_;
  auVar75._24_4_ = auVar70._24_4_ * auVar78._24_4_;
  auVar75._28_4_ = auVar73._28_4_;
  auVar72 = vfmadd231ps_avx512vl(auVar71,auVar79,auVar72);
  auVar53 = vfmadd231ps_fma(auVar82,auVar79,auVar85);
  auVar52 = vfmadd231ps_fma(auVar75,auVar79,auVar77);
  auVar72 = vfmadd231ps_avx512vl(auVar72,auVar142,auVar74);
  auVar53 = vfmadd231ps_fma(ZEXT1632(auVar53),auVar142,auVar84);
  auVar52 = vfmadd231ps_fma(ZEXT1632(auVar52),auVar142,auVar76);
  auVar86._8_4_ = 0x7fffffff;
  auVar86._0_8_ = 0x7fffffff7fffffff;
  auVar86._12_4_ = 0x7fffffff;
  auVar86._16_4_ = 0x7fffffff;
  auVar86._20_4_ = 0x7fffffff;
  auVar86._24_4_ = 0x7fffffff;
  auVar86._28_4_ = 0x7fffffff;
  auVar74 = vandps_avx(ZEXT1632(auVar42),auVar86);
  auVar88._8_4_ = 0x219392ef;
  auVar88._0_8_ = 0x219392ef219392ef;
  auVar88._12_4_ = 0x219392ef;
  auVar88._16_4_ = 0x219392ef;
  auVar88._20_4_ = 0x219392ef;
  auVar88._24_4_ = 0x219392ef;
  auVar88._28_4_ = 0x219392ef;
  uVar35 = vcmpps_avx512vl(auVar74,auVar88,1);
  bVar37 = (bool)((byte)uVar35 & 1);
  auVar71._0_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar42._0_4_;
  bVar37 = (bool)((byte)(uVar35 >> 1) & 1);
  auVar71._4_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar42._4_4_;
  bVar37 = (bool)((byte)(uVar35 >> 2) & 1);
  auVar71._8_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar42._8_4_;
  bVar37 = (bool)((byte)(uVar35 >> 3) & 1);
  auVar71._12_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar42._12_4_;
  auVar71._16_4_ = (uint)((byte)(uVar35 >> 4) & 1) * 0x219392ef;
  auVar71._20_4_ = (uint)((byte)(uVar35 >> 5) & 1) * 0x219392ef;
  auVar71._24_4_ = (uint)((byte)(uVar35 >> 6) & 1) * 0x219392ef;
  auVar71._28_4_ = (uint)(byte)(uVar35 >> 7) * 0x219392ef;
  auVar74 = vandps_avx(ZEXT1632(auVar54),auVar86);
  uVar35 = vcmpps_avx512vl(auVar74,auVar88,1);
  bVar37 = (bool)((byte)uVar35 & 1);
  auVar68._0_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar54._0_4_;
  bVar37 = (bool)((byte)(uVar35 >> 1) & 1);
  auVar68._4_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar54._4_4_;
  bVar37 = (bool)((byte)(uVar35 >> 2) & 1);
  auVar68._8_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar54._8_4_;
  bVar37 = (bool)((byte)(uVar35 >> 3) & 1);
  auVar68._12_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar54._12_4_;
  auVar68._16_4_ = (uint)((byte)(uVar35 >> 4) & 1) * 0x219392ef;
  auVar68._20_4_ = (uint)((byte)(uVar35 >> 5) & 1) * 0x219392ef;
  auVar68._24_4_ = (uint)((byte)(uVar35 >> 6) & 1) * 0x219392ef;
  auVar68._28_4_ = (uint)(byte)(uVar35 >> 7) * 0x219392ef;
  auVar74 = vandps_avx(ZEXT1632(auVar3),auVar86);
  uVar35 = vcmpps_avx512vl(auVar74,auVar88,1);
  bVar37 = (bool)((byte)uVar35 & 1);
  auVar74._0_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar3._0_4_;
  bVar37 = (bool)((byte)(uVar35 >> 1) & 1);
  auVar74._4_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar3._4_4_;
  bVar37 = (bool)((byte)(uVar35 >> 2) & 1);
  auVar74._8_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar3._8_4_;
  bVar37 = (bool)((byte)(uVar35 >> 3) & 1);
  auVar74._12_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar3._12_4_;
  auVar74._16_4_ = (uint)((byte)(uVar35 >> 4) & 1) * 0x219392ef;
  auVar74._20_4_ = (uint)((byte)(uVar35 >> 5) & 1) * 0x219392ef;
  auVar74._24_4_ = (uint)((byte)(uVar35 >> 6) & 1) * 0x219392ef;
  auVar74._28_4_ = (uint)(byte)(uVar35 >> 7) * 0x219392ef;
  auVar73 = vrcp14ps_avx512vl(auVar71);
  auVar87._8_4_ = 0x3f800000;
  auVar87._0_8_ = 0x3f8000003f800000;
  auVar87._12_4_ = 0x3f800000;
  auVar87._16_4_ = 0x3f800000;
  auVar87._20_4_ = 0x3f800000;
  auVar87._24_4_ = 0x3f800000;
  auVar87._28_4_ = 0x3f800000;
  auVar42 = vfnmadd213ps_fma(auVar71,auVar73,auVar87);
  auVar42 = vfmadd132ps_fma(ZEXT1632(auVar42),auVar73,auVar73);
  auVar73 = vrcp14ps_avx512vl(auVar68);
  auVar54 = vfnmadd213ps_fma(auVar68,auVar73,auVar87);
  auVar54 = vfmadd132ps_fma(ZEXT1632(auVar54),auVar73,auVar73);
  auVar73 = vrcp14ps_avx512vl(auVar74);
  auVar3 = vfnmadd213ps_fma(auVar74,auVar73,auVar87);
  auVar3 = vfmadd132ps_fma(ZEXT1632(auVar3),auVar73,auVar73);
  auVar74 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar29 * 7 + 6));
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar74 = vsubps_avx512vl(auVar74,auVar72);
  auVar76._4_4_ = auVar42._4_4_ * auVar74._4_4_;
  auVar76._0_4_ = auVar42._0_4_ * auVar74._0_4_;
  auVar76._8_4_ = auVar42._8_4_ * auVar74._8_4_;
  auVar76._12_4_ = auVar42._12_4_ * auVar74._12_4_;
  auVar76._16_4_ = auVar74._16_4_ * 0.0;
  auVar76._20_4_ = auVar74._20_4_ * 0.0;
  auVar76._24_4_ = auVar74._24_4_ * 0.0;
  auVar76._28_4_ = auVar74._28_4_;
  auVar74 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar29 * 9 + 6));
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar74 = vsubps_avx512vl(auVar74,auVar72);
  auVar83._0_4_ = auVar42._0_4_ * auVar74._0_4_;
  auVar83._4_4_ = auVar42._4_4_ * auVar74._4_4_;
  auVar83._8_4_ = auVar42._8_4_ * auVar74._8_4_;
  auVar83._12_4_ = auVar42._12_4_ * auVar74._12_4_;
  auVar83._16_4_ = auVar74._16_4_ * 0.0;
  auVar83._20_4_ = auVar74._20_4_ * 0.0;
  auVar83._24_4_ = auVar74._24_4_ * 0.0;
  auVar83._28_4_ = 0;
  auVar74 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar29 * 0xe + 6));
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar74 = vsubps_avx(auVar74,ZEXT1632(auVar53));
  auVar77._4_4_ = auVar54._4_4_ * auVar74._4_4_;
  auVar77._0_4_ = auVar54._0_4_ * auVar74._0_4_;
  auVar77._8_4_ = auVar54._8_4_ * auVar74._8_4_;
  auVar77._12_4_ = auVar54._12_4_ * auVar74._12_4_;
  auVar77._16_4_ = auVar74._16_4_ * 0.0;
  auVar77._20_4_ = auVar74._20_4_ * 0.0;
  auVar77._24_4_ = auVar74._24_4_ * 0.0;
  auVar77._28_4_ = auVar74._28_4_;
  auVar74 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar74 = vsubps_avx(auVar74,ZEXT1632(auVar53));
  auVar81._0_4_ = auVar54._0_4_ * auVar74._0_4_;
  auVar81._4_4_ = auVar54._4_4_ * auVar74._4_4_;
  auVar81._8_4_ = auVar54._8_4_ * auVar74._8_4_;
  auVar81._12_4_ = auVar54._12_4_ * auVar74._12_4_;
  auVar81._16_4_ = auVar74._16_4_ * 0.0;
  auVar81._20_4_ = auVar74._20_4_ * 0.0;
  auVar81._24_4_ = auVar74._24_4_ * 0.0;
  auVar81._28_4_ = 0;
  auVar74 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar29 * 0x15 + 6));
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar74 = vsubps_avx(auVar74,ZEXT1632(auVar52));
  auVar78._4_4_ = auVar74._4_4_ * auVar3._4_4_;
  auVar78._0_4_ = auVar74._0_4_ * auVar3._0_4_;
  auVar78._8_4_ = auVar74._8_4_ * auVar3._8_4_;
  auVar78._12_4_ = auVar74._12_4_ * auVar3._12_4_;
  auVar78._16_4_ = auVar74._16_4_ * 0.0;
  auVar78._20_4_ = auVar74._20_4_ * 0.0;
  auVar78._24_4_ = auVar74._24_4_ * 0.0;
  auVar78._28_4_ = auVar74._28_4_;
  auVar74 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar29 * 0x17 + 6));
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar74 = vsubps_avx(auVar74,ZEXT1632(auVar52));
  auVar69._0_4_ = auVar3._0_4_ * auVar74._0_4_;
  auVar69._4_4_ = auVar3._4_4_ * auVar74._4_4_;
  auVar69._8_4_ = auVar3._8_4_ * auVar74._8_4_;
  auVar69._12_4_ = auVar3._12_4_ * auVar74._12_4_;
  auVar69._16_4_ = auVar74._16_4_ * 0.0;
  auVar69._20_4_ = auVar74._20_4_ * 0.0;
  auVar69._24_4_ = auVar74._24_4_ * 0.0;
  auVar69._28_4_ = 0;
  auVar74 = vpminsd_avx2(auVar76,auVar83);
  auVar72 = vpminsd_avx2(auVar77,auVar81);
  auVar74 = vmaxps_avx(auVar74,auVar72);
  auVar72 = vpminsd_avx2(auVar78,auVar69);
  uVar112 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar73._4_4_ = uVar112;
  auVar73._0_4_ = uVar112;
  auVar73._8_4_ = uVar112;
  auVar73._12_4_ = uVar112;
  auVar73._16_4_ = uVar112;
  auVar73._20_4_ = uVar112;
  auVar73._24_4_ = uVar112;
  auVar73._28_4_ = uVar112;
  auVar72 = vmaxps_avx512vl(auVar72,auVar73);
  auVar74 = vmaxps_avx(auVar74,auVar72);
  auVar72._8_4_ = 0x3f7ffffa;
  auVar72._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar72._12_4_ = 0x3f7ffffa;
  auVar72._16_4_ = 0x3f7ffffa;
  auVar72._20_4_ = 0x3f7ffffa;
  auVar72._24_4_ = 0x3f7ffffa;
  auVar72._28_4_ = 0x3f7ffffa;
  local_3c0 = vmulps_avx512vl(auVar74,auVar72);
  auVar74 = vpmaxsd_avx2(auVar76,auVar83);
  auVar72 = vpmaxsd_avx2(auVar77,auVar81);
  auVar74 = vminps_avx(auVar74,auVar72);
  auVar72 = vpmaxsd_avx2(auVar78,auVar69);
  uVar112 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar84._4_4_ = uVar112;
  auVar84._0_4_ = uVar112;
  auVar84._8_4_ = uVar112;
  auVar84._12_4_ = uVar112;
  auVar84._16_4_ = uVar112;
  auVar84._20_4_ = uVar112;
  auVar84._24_4_ = uVar112;
  auVar84._28_4_ = uVar112;
  auVar72 = vminps_avx512vl(auVar72,auVar84);
  auVar74 = vminps_avx(auVar74,auVar72);
  auVar85._8_4_ = 0x3f800003;
  auVar85._0_8_ = 0x3f8000033f800003;
  auVar85._12_4_ = 0x3f800003;
  auVar85._16_4_ = 0x3f800003;
  auVar85._20_4_ = 0x3f800003;
  auVar85._24_4_ = 0x3f800003;
  auVar85._28_4_ = 0x3f800003;
  auVar74 = vmulps_avx512vl(auVar74,auVar85);
  auVar72 = vpbroadcastd_avx512vl();
  uVar12 = vcmpps_avx512vl(local_3c0,auVar74,2);
  uVar13 = vpcmpgtd_avx512vl(auVar72,_DAT_01fb4ba0);
  uVar35 = CONCAT44((int)((ulong)in_R10 >> 0x20),(uint)(byte)((byte)uVar12 & (byte)uVar13));
  auVar42 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar247 = ZEXT1664(auVar42);
  auVar108 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_380 = vmovdqa64_avx512f(auVar108);
  auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar108 = ZEXT1664(auVar42);
  auVar42 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar238 = ZEXT1664(auVar42);
  auVar246 = ZEXT464(0x3f800000);
LAB_01a6b49d:
  if (uVar35 == 0) {
LAB_01a6d047:
    return uVar35 != 0;
  }
  lVar31 = 0;
  for (uVar29 = uVar35; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000) {
    lVar31 = lVar31 + 1;
  }
  uVar6 = *(uint *)(prim + 2);
  pGVar8 = (context->scene->geometries).items[uVar6].ptr;
  uVar29 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar31 * 4 + 6));
  p_Var9 = pGVar8[1].intersectionFilterN;
  pvVar10 = pGVar8[2].userPtr;
  _Var11 = pGVar8[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar42 = *(undefined1 (*) [16])(_Var11 + uVar29 * (long)pvVar10);
  auVar54 = *(undefined1 (*) [16])(_Var11 + (uVar29 + 1) * (long)pvVar10);
  auVar3 = *(undefined1 (*) [16])(_Var11 + (uVar29 + 2) * (long)pvVar10);
  auVar53 = *(undefined1 (*) [16])(_Var11 + (long)pvVar10 * (uVar29 + 3));
  lVar31 = *(long *)&pGVar8[1].time_range.upper;
  auVar52 = *(undefined1 (*) [16])(lVar31 + (long)p_Var9 * uVar29);
  auVar51 = *(undefined1 (*) [16])(lVar31 + (long)p_Var9 * (uVar29 + 1));
  auVar4 = *(undefined1 (*) [16])(lVar31 + (long)p_Var9 * (uVar29 + 2));
  uVar36 = uVar35 - 1 & uVar35;
  auVar50 = *(undefined1 (*) [16])(lVar31 + (long)p_Var9 * (uVar29 + 3));
  if (uVar36 != 0) {
    uVar34 = uVar36 - 1 & uVar36;
    for (uVar29 = uVar36; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000) {
    }
    if (uVar34 != 0) {
      for (; (uVar34 & 1) == 0; uVar34 = uVar34 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar5 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x1c
                        );
  auVar5 = vinsertps_avx(auVar5,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  auVar114 = auVar247._0_16_;
  auVar43 = vmulps_avx512vl(auVar50,auVar114);
  auVar45 = vfmadd213ps_fma((undefined1  [16])0x0,auVar4,auVar43);
  auVar44._0_4_ = auVar51._0_4_ + auVar45._0_4_;
  auVar44._4_4_ = auVar51._4_4_ + auVar45._4_4_;
  auVar44._8_4_ = auVar51._8_4_ + auVar45._8_4_;
  auVar44._12_4_ = auVar51._12_4_ + auVar45._12_4_;
  auVar44 = vfmadd231ps_avx512vl(auVar44,auVar52,auVar114);
  auVar63 = ZEXT816(0) << 0x40;
  auVar48._0_4_ = auVar50._0_4_ * 0.0;
  auVar48._4_4_ = auVar50._4_4_ * 0.0;
  auVar48._8_4_ = auVar50._8_4_ * 0.0;
  auVar48._12_4_ = auVar50._12_4_ * 0.0;
  auVar67 = auVar108._0_16_;
  auVar45 = vfmadd231ps_avx512vl(auVar48,auVar4,auVar67);
  auVar45 = vfmadd231ps_fma(auVar45,auVar51,auVar63);
  auVar46 = vfnmadd231ps_avx512vl(auVar45,auVar52,auVar67);
  auVar47 = vmulps_avx512vl(auVar53,auVar114);
  auVar45 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar3,auVar47);
  auVar224._0_4_ = auVar45._0_4_ + auVar54._0_4_;
  auVar224._4_4_ = auVar45._4_4_ + auVar54._4_4_;
  auVar224._8_4_ = auVar45._8_4_ + auVar54._8_4_;
  auVar224._12_4_ = auVar45._12_4_ + auVar54._12_4_;
  auVar48 = vfmadd231ps_avx512vl(auVar224,auVar42,auVar114);
  auVar228._0_4_ = auVar53._0_4_ * 0.0;
  auVar228._4_4_ = auVar53._4_4_ * 0.0;
  auVar228._8_4_ = auVar53._8_4_ * 0.0;
  auVar228._12_4_ = auVar53._12_4_ * 0.0;
  auVar45 = vfmadd231ps_avx512vl(auVar228,auVar3,auVar67);
  auVar45 = vfmadd231ps_fma(auVar45,auVar54,auVar63);
  auVar49 = vfnmadd231ps_avx512vl(auVar45,auVar42,auVar67);
  auVar58._0_4_ = auVar4._0_4_ + auVar43._0_4_;
  auVar58._4_4_ = auVar4._4_4_ + auVar43._4_4_;
  auVar58._8_4_ = auVar4._8_4_ + auVar43._8_4_;
  auVar58._12_4_ = auVar4._12_4_ + auVar43._12_4_;
  auVar45 = vfmadd231ps_fma(auVar58,auVar51,auVar63);
  auVar45 = vfmadd231ps_avx512vl(auVar45,auVar52,auVar114);
  auVar50 = vmulps_avx512vl(auVar50,auVar67);
  auVar4 = vfmadd231ps_fma(auVar50,auVar63,auVar4);
  auVar51 = vfnmadd231ps_avx512vl(auVar4,auVar67,auVar51);
  auVar4 = vfmadd231ps_fma(auVar51,auVar63,auVar52);
  auVar175._0_4_ = auVar47._0_4_ + auVar3._0_4_;
  auVar175._4_4_ = auVar47._4_4_ + auVar3._4_4_;
  auVar175._8_4_ = auVar47._8_4_ + auVar3._8_4_;
  auVar175._12_4_ = auVar47._12_4_ + auVar3._12_4_;
  auVar52 = vfmadd231ps_fma(auVar175,auVar54,auVar63);
  auVar52 = vfmadd231ps_avx512vl(auVar52,auVar42,auVar114);
  auVar53 = vmulps_avx512vl(auVar53,auVar67);
  auVar3 = vfmadd231ps_fma(auVar53,auVar63,auVar3);
  auVar54 = vfnmadd231ps_avx512vl(auVar3,auVar67,auVar54);
  auVar51 = vfmadd231ps_fma(auVar54,auVar63,auVar42);
  auVar42 = vshufps_avx(auVar46,auVar46,0xc9);
  auVar54 = vshufps_avx(auVar48,auVar48,0xc9);
  fVar211 = auVar46._0_4_;
  auVar62._0_4_ = fVar211 * auVar54._0_4_;
  fVar109 = auVar46._4_4_;
  auVar62._4_4_ = fVar109 * auVar54._4_4_;
  fVar110 = auVar46._8_4_;
  auVar62._8_4_ = fVar110 * auVar54._8_4_;
  fVar111 = auVar46._12_4_;
  auVar62._12_4_ = fVar111 * auVar54._12_4_;
  auVar54 = vfmsub231ps_fma(auVar62,auVar42,auVar48);
  auVar3 = vshufps_avx(auVar54,auVar54,0xc9);
  auVar54 = vshufps_avx(auVar49,auVar49,0xc9);
  auVar64._0_4_ = fVar211 * auVar54._0_4_;
  auVar64._4_4_ = fVar109 * auVar54._4_4_;
  auVar64._8_4_ = fVar110 * auVar54._8_4_;
  auVar64._12_4_ = fVar111 * auVar54._12_4_;
  auVar42 = vfmsub231ps_fma(auVar64,auVar42,auVar49);
  auVar53 = vshufps_avx(auVar42,auVar42,0xc9);
  auVar42 = vshufps_avx(auVar4,auVar4,0xc9);
  auVar54 = vshufps_avx(auVar52,auVar52,0xc9);
  fVar120 = auVar4._0_4_;
  auVar55._0_4_ = fVar120 * auVar54._0_4_;
  fVar132 = auVar4._4_4_;
  auVar55._4_4_ = fVar132 * auVar54._4_4_;
  fVar133 = auVar4._8_4_;
  auVar55._8_4_ = fVar133 * auVar54._8_4_;
  fVar134 = auVar4._12_4_;
  auVar55._12_4_ = fVar134 * auVar54._12_4_;
  auVar54 = vfmsub231ps_fma(auVar55,auVar42,auVar52);
  auVar52 = vshufps_avx(auVar54,auVar54,0xc9);
  auVar54 = vshufps_avx(auVar51,auVar51,0xc9);
  auVar176._0_4_ = auVar54._0_4_ * fVar120;
  auVar176._4_4_ = auVar54._4_4_ * fVar132;
  auVar176._8_4_ = auVar54._8_4_ * fVar133;
  auVar176._12_4_ = auVar54._12_4_ * fVar134;
  auVar42 = vfmsub231ps_fma(auVar176,auVar42,auVar51);
  auVar51 = vshufps_avx(auVar42,auVar42,0xc9);
  auVar42 = vdpps_avx(auVar3,auVar3,0x7f);
  fVar103 = auVar42._0_4_;
  auVar177._4_12_ = ZEXT812(0) << 0x20;
  auVar177._0_4_ = fVar103;
  auVar54 = vrsqrt14ss_avx512f(auVar63,auVar177);
  auVar50 = vmulss_avx512f(auVar54,ZEXT416(0x3fc00000));
  auVar43 = vmulss_avx512f(auVar42,ZEXT416(0xbf000000));
  fVar196 = auVar54._0_4_;
  fVar196 = auVar50._0_4_ + auVar43._0_4_ * fVar196 * fVar196 * fVar196;
  fVar213 = fVar196 * auVar3._0_4_;
  fVar221 = fVar196 * auVar3._4_4_;
  fVar222 = fVar196 * auVar3._8_4_;
  fVar223 = fVar196 * auVar3._12_4_;
  auVar54 = vdpps_avx(auVar3,auVar53,0x7f);
  auVar189._0_4_ = auVar53._0_4_ * fVar103;
  auVar189._4_4_ = auVar53._4_4_ * fVar103;
  auVar189._8_4_ = auVar53._8_4_ * fVar103;
  auVar189._12_4_ = auVar53._12_4_ * fVar103;
  fVar103 = auVar54._0_4_;
  auVar154._0_4_ = fVar103 * auVar3._0_4_;
  auVar154._4_4_ = fVar103 * auVar3._4_4_;
  auVar154._8_4_ = fVar103 * auVar3._8_4_;
  auVar154._12_4_ = fVar103 * auVar3._12_4_;
  auVar3 = vsubps_avx(auVar189,auVar154);
  auVar54 = vrcp14ss_avx512f(auVar63,auVar177);
  auVar42 = vfnmadd213ss_avx512f(auVar42,auVar54,ZEXT416(0x40000000));
  fVar198 = auVar54._0_4_ * auVar42._0_4_;
  auVar42 = vdpps_avx(auVar52,auVar52,0x7f);
  fVar209 = auVar42._0_4_;
  auVar168._4_12_ = ZEXT812(0) << 0x20;
  auVar168._0_4_ = fVar209;
  auVar54 = vrsqrt14ss_avx512f(auVar63,auVar168);
  auVar53 = vmulss_avx512f(auVar54,ZEXT416(0x3fc00000));
  auVar50 = vmulss_avx512f(auVar42,ZEXT416(0xbf000000));
  fVar103 = auVar54._0_4_;
  fVar103 = auVar53._0_4_ + auVar50._0_4_ * fVar103 * fVar103 * fVar103;
  fVar197 = fVar103 * auVar52._0_4_;
  fVar208 = fVar103 * auVar52._4_4_;
  fVar210 = fVar103 * auVar52._8_4_;
  fVar212 = fVar103 * auVar52._12_4_;
  auVar54 = vdpps_avx(auVar52,auVar51,0x7f);
  auVar65._0_4_ = fVar209 * auVar51._0_4_;
  auVar65._4_4_ = fVar209 * auVar51._4_4_;
  auVar65._8_4_ = fVar209 * auVar51._8_4_;
  auVar65._12_4_ = fVar209 * auVar51._12_4_;
  fVar209 = auVar54._0_4_;
  auVar56._0_4_ = fVar209 * auVar52._0_4_;
  auVar56._4_4_ = fVar209 * auVar52._4_4_;
  auVar56._8_4_ = fVar209 * auVar52._8_4_;
  auVar56._12_4_ = fVar209 * auVar52._12_4_;
  auVar53 = vsubps_avx(auVar65,auVar56);
  auVar54 = vrcp14ss_avx512f(auVar63,auVar168);
  auVar42 = vfnmadd213ss_avx512f(auVar42,auVar54,ZEXT416(0x40000000));
  fVar209 = auVar42._0_4_ * auVar54._0_4_;
  auVar42 = vshufps_avx(auVar44,auVar44,0xff);
  auVar169._0_4_ = fVar213 * auVar42._0_4_;
  auVar169._4_4_ = fVar221 * auVar42._4_4_;
  auVar169._8_4_ = fVar222 * auVar42._8_4_;
  auVar169._12_4_ = fVar223 * auVar42._12_4_;
  local_540 = vsubps_avx(auVar44,auVar169);
  auVar54 = vshufps_avx(auVar46,auVar46,0xff);
  auVar145._0_4_ = auVar54._0_4_ * fVar213 + auVar42._0_4_ * fVar196 * fVar198 * auVar3._0_4_;
  auVar145._4_4_ = auVar54._4_4_ * fVar221 + auVar42._4_4_ * fVar196 * fVar198 * auVar3._4_4_;
  auVar145._8_4_ = auVar54._8_4_ * fVar222 + auVar42._8_4_ * fVar196 * fVar198 * auVar3._8_4_;
  auVar145._12_4_ = auVar54._12_4_ * fVar223 + auVar42._12_4_ * fVar196 * fVar198 * auVar3._12_4_;
  auVar3 = vsubps_avx(auVar46,auVar145);
  local_550._0_4_ = auVar169._0_4_ + auVar44._0_4_;
  local_550._4_4_ = auVar169._4_4_ + auVar44._4_4_;
  fStack_548 = auVar169._8_4_ + auVar44._8_4_;
  fStack_544 = auVar169._12_4_ + auVar44._12_4_;
  auVar42 = vshufps_avx(auVar45,auVar45,0xff);
  auVar146._0_4_ = fVar197 * auVar42._0_4_;
  auVar146._4_4_ = fVar208 * auVar42._4_4_;
  auVar146._8_4_ = fVar210 * auVar42._8_4_;
  auVar146._12_4_ = fVar212 * auVar42._12_4_;
  local_560 = vsubps_avx(auVar45,auVar146);
  auVar54 = vshufps_avx(auVar4,auVar4,0xff);
  auVar63._0_4_ = auVar54._0_4_ * fVar197 + auVar42._0_4_ * fVar103 * auVar53._0_4_ * fVar209;
  auVar63._4_4_ = auVar54._4_4_ * fVar208 + auVar42._4_4_ * fVar103 * auVar53._4_4_ * fVar209;
  auVar63._8_4_ = auVar54._8_4_ * fVar210 + auVar42._8_4_ * fVar103 * auVar53._8_4_ * fVar209;
  auVar63._12_4_ = auVar54._12_4_ * fVar212 + auVar42._12_4_ * fVar103 * auVar53._12_4_ * fVar209;
  auVar42 = vsubps_avx(auVar4,auVar63);
  _local_570 = vaddps_avx512vl(auVar45,auVar146);
  auVar61._0_4_ = auVar3._0_4_ * 0.33333334;
  auVar61._4_4_ = auVar3._4_4_ * 0.33333334;
  auVar61._8_4_ = auVar3._8_4_ * 0.33333334;
  auVar61._12_4_ = auVar3._12_4_ * 0.33333334;
  local_580 = vaddps_avx512vl(local_540,auVar61);
  auVar59._0_4_ = auVar42._0_4_ * 0.33333334;
  auVar59._4_4_ = auVar42._4_4_ * 0.33333334;
  auVar59._8_4_ = auVar42._8_4_ * 0.33333334;
  auVar59._12_4_ = auVar42._12_4_ * 0.33333334;
  local_590 = vsubps_avx512vl(local_560,auVar59);
  auVar43._0_4_ = (fVar211 + auVar145._0_4_) * 0.33333334;
  auVar43._4_4_ = (fVar109 + auVar145._4_4_) * 0.33333334;
  auVar43._8_4_ = (fVar110 + auVar145._8_4_) * 0.33333334;
  auVar43._12_4_ = (fVar111 + auVar145._12_4_) * 0.33333334;
  _local_5a0 = vaddps_avx512vl(_local_550,auVar43);
  auVar46._0_4_ = (fVar120 + auVar63._0_4_) * 0.33333334;
  auVar46._4_4_ = (fVar132 + auVar63._4_4_) * 0.33333334;
  auVar46._8_4_ = (fVar133 + auVar63._8_4_) * 0.33333334;
  auVar46._12_4_ = (fVar134 + auVar63._12_4_) * 0.33333334;
  _local_5b0 = vsubps_avx512vl(_local_570,auVar46);
  local_4c0 = vsubps_avx(local_540,auVar5);
  uVar112 = local_4c0._0_4_;
  auVar67._4_4_ = uVar112;
  auVar67._0_4_ = uVar112;
  auVar67._8_4_ = uVar112;
  auVar67._12_4_ = uVar112;
  auVar42 = vshufps_avx(local_4c0,local_4c0,0x55);
  auVar54 = vshufps_avx(local_4c0,local_4c0,0xaa);
  aVar1 = pre->ray_space[k].vx.field_0;
  aVar2 = pre->ray_space[k].vy.field_0;
  fVar196 = pre->ray_space[k].vz.field_0.m128[0];
  fVar103 = pre->ray_space[k].vz.field_0.m128[1];
  fVar198 = pre->ray_space[k].vz.field_0.m128[2];
  fVar209 = pre->ray_space[k].vz.field_0.m128[3];
  auVar47._0_4_ = fVar196 * auVar54._0_4_;
  auVar47._4_4_ = fVar103 * auVar54._4_4_;
  auVar47._8_4_ = fVar198 * auVar54._8_4_;
  auVar47._12_4_ = fVar209 * auVar54._12_4_;
  auVar42 = vfmadd231ps_fma(auVar47,(undefined1  [16])aVar2,auVar42);
  auVar50 = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar1,auVar67);
  local_4d0 = vsubps_avx512vl(local_580,auVar5);
  uVar112 = local_4d0._0_4_;
  auVar60._4_4_ = uVar112;
  auVar60._0_4_ = uVar112;
  auVar60._8_4_ = uVar112;
  auVar60._12_4_ = uVar112;
  auVar42 = vshufps_avx(local_4d0,local_4d0,0x55);
  auVar54 = vshufps_avx(local_4d0,local_4d0,0xaa);
  auVar57._0_4_ = fVar196 * auVar54._0_4_;
  auVar57._4_4_ = fVar103 * auVar54._4_4_;
  auVar57._8_4_ = fVar198 * auVar54._8_4_;
  auVar57._12_4_ = fVar209 * auVar54._12_4_;
  auVar42 = vfmadd231ps_fma(auVar57,(undefined1  [16])aVar2,auVar42);
  auVar45 = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar1,auVar60);
  local_4e0 = vsubps_avx512vl(local_590,auVar5);
  uVar112 = local_4e0._0_4_;
  auVar155._4_4_ = uVar112;
  auVar155._0_4_ = uVar112;
  auVar155._8_4_ = uVar112;
  auVar155._12_4_ = uVar112;
  auVar42 = vshufps_avx(local_4e0,local_4e0,0x55);
  auVar54 = vshufps_avx(local_4e0,local_4e0,0xaa);
  auVar66._0_4_ = fVar196 * auVar54._0_4_;
  auVar66._4_4_ = fVar103 * auVar54._4_4_;
  auVar66._8_4_ = fVar198 * auVar54._8_4_;
  auVar66._12_4_ = fVar209 * auVar54._12_4_;
  auVar42 = vfmadd231ps_fma(auVar66,(undefined1  [16])aVar2,auVar42);
  auVar43 = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar1,auVar155);
  local_4f0 = vsubps_avx(local_560,auVar5);
  uVar112 = local_4f0._0_4_;
  auVar156._4_4_ = uVar112;
  auVar156._0_4_ = uVar112;
  auVar156._8_4_ = uVar112;
  auVar156._12_4_ = uVar112;
  auVar42 = vshufps_avx(local_4f0,local_4f0,0x55);
  auVar54 = vshufps_avx(local_4f0,local_4f0,0xaa);
  auVar178._0_4_ = auVar54._0_4_ * fVar196;
  auVar178._4_4_ = auVar54._4_4_ * fVar103;
  auVar178._8_4_ = auVar54._8_4_ * fVar198;
  auVar178._12_4_ = auVar54._12_4_ * fVar209;
  auVar42 = vfmadd231ps_fma(auVar178,(undefined1  [16])aVar2,auVar42);
  auVar44 = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar1,auVar156);
  local_500 = vsubps_avx(_local_550,auVar5);
  uVar112 = local_500._0_4_;
  auVar157._4_4_ = uVar112;
  auVar157._0_4_ = uVar112;
  auVar157._8_4_ = uVar112;
  auVar157._12_4_ = uVar112;
  auVar42 = vshufps_avx(local_500,local_500,0x55);
  auVar54 = vshufps_avx(local_500,local_500,0xaa);
  auVar190._0_4_ = auVar54._0_4_ * fVar196;
  auVar190._4_4_ = auVar54._4_4_ * fVar103;
  auVar190._8_4_ = auVar54._8_4_ * fVar198;
  auVar190._12_4_ = auVar54._12_4_ * fVar209;
  auVar42 = vfmadd231ps_fma(auVar190,(undefined1  [16])aVar2,auVar42);
  auVar46 = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar1,auVar157);
  local_510 = vsubps_avx512vl(_local_5a0,auVar5);
  uVar112 = local_510._0_4_;
  auVar158._4_4_ = uVar112;
  auVar158._0_4_ = uVar112;
  auVar158._8_4_ = uVar112;
  auVar158._12_4_ = uVar112;
  auVar42 = vshufps_avx(local_510,local_510,0x55);
  auVar54 = vshufps_avx(local_510,local_510,0xaa);
  auVar199._0_4_ = auVar54._0_4_ * fVar196;
  auVar199._4_4_ = auVar54._4_4_ * fVar103;
  auVar199._8_4_ = auVar54._8_4_ * fVar198;
  auVar199._12_4_ = auVar54._12_4_ * fVar209;
  auVar42 = vfmadd231ps_fma(auVar199,(undefined1  [16])aVar2,auVar42);
  auVar47 = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar1,auVar158);
  local_520 = vsubps_avx512vl(_local_5b0,auVar5);
  uVar112 = local_520._0_4_;
  auVar159._4_4_ = uVar112;
  auVar159._0_4_ = uVar112;
  auVar159._8_4_ = uVar112;
  auVar159._12_4_ = uVar112;
  auVar42 = vshufps_avx(local_520,local_520,0x55);
  auVar54 = vshufps_avx(local_520,local_520,0xaa);
  auVar214._0_4_ = auVar54._0_4_ * fVar196;
  auVar214._4_4_ = auVar54._4_4_ * fVar103;
  auVar214._8_4_ = auVar54._8_4_ * fVar198;
  auVar214._12_4_ = auVar54._12_4_ * fVar209;
  auVar42 = vfmadd231ps_fma(auVar214,(undefined1  [16])aVar2,auVar42);
  auVar48 = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar1,auVar159);
  local_530 = vsubps_avx512vl(_local_570,auVar5);
  uVar112 = local_530._0_4_;
  auVar49._4_4_ = uVar112;
  auVar49._0_4_ = uVar112;
  auVar49._8_4_ = uVar112;
  auVar49._12_4_ = uVar112;
  auVar42 = vshufps_avx(local_530,local_530,0x55);
  auVar54 = vshufps_avx(local_530,local_530,0xaa);
  auVar147._0_4_ = auVar54._0_4_ * fVar196;
  auVar147._4_4_ = auVar54._4_4_ * fVar103;
  auVar147._8_4_ = auVar54._8_4_ * fVar198;
  auVar147._12_4_ = auVar54._12_4_ * fVar209;
  auVar42 = vfmadd231ps_fma(auVar147,(undefined1  [16])aVar2,auVar42);
  auVar5 = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar1,auVar49);
  auVar3 = vmovlhps_avx(auVar50,auVar46);
  auVar51 = vmovlhps_avx512f(auVar45,auVar47);
  auVar4 = vmovlhps_avx512f(auVar43,auVar48);
  _local_4a0 = vmovlhps_avx512f(auVar44,auVar5);
  auVar42 = vminps_avx512vl(auVar3,auVar51);
  auVar53 = vmaxps_avx512vl(auVar3,auVar51);
  auVar54 = vminps_avx512vl(auVar4,_local_4a0);
  auVar54 = vminps_avx(auVar42,auVar54);
  auVar42 = vmaxps_avx512vl(auVar4,_local_4a0);
  auVar42 = vmaxps_avx(auVar53,auVar42);
  auVar53 = vshufpd_avx(auVar54,auVar54,3);
  auVar52 = vshufpd_avx(auVar42,auVar42,3);
  auVar54 = vminps_avx(auVar54,auVar53);
  auVar42 = vmaxps_avx(auVar42,auVar52);
  auVar54 = vandps_avx512vl(auVar54,auVar238._0_16_);
  auVar42 = vandps_avx512vl(auVar42,auVar238._0_16_);
  auVar42 = vmaxps_avx(auVar54,auVar42);
  auVar54 = vmovshdup_avx(auVar42);
  auVar42 = vmaxss_avx(auVar54,auVar42);
  auVar160._8_8_ = auVar50._0_8_;
  auVar160._0_8_ = auVar50._0_8_;
  auVar54 = vmovddup_avx512vl(auVar45);
  auVar53 = vmovddup_avx512vl(auVar43);
  auVar179._0_8_ = auVar44._0_8_;
  auVar179._8_8_ = auVar179._0_8_;
  local_4b0 = ZEXT416((uint)(auVar42._0_4_ * 9.536743e-07));
  local_440 = vbroadcastss_avx512vl(local_4b0);
  auVar42 = vxorps_avx512vl(local_440._0_16_,auVar114);
  local_460 = vbroadcastss_avx512vl(auVar42);
  auVar108 = vpbroadcastd_avx512f();
  local_300 = vmovdqa64_avx512f(auVar108);
  bVar37 = false;
  uVar29 = 0;
  fVar196 = *(float *)(ray + k * 4 + 0xc0);
  local_470 = vsubps_avx512vl(auVar51,auVar3);
  local_480 = vsubps_avx512vl(auVar4,auVar51);
  local_490 = vsubps_avx512vl(_local_4a0,auVar4);
  local_5c0 = vsubps_avx(_local_550,local_540);
  local_5d0 = vsubps_avx512vl(_local_5a0,local_580);
  local_5e0 = vsubps_avx512vl(_local_5b0,local_590);
  _local_5f0 = vsubps_avx512vl(_local_570,local_560);
  auVar108 = vpbroadcastd_avx512f();
  local_340 = vmovdqa64_avx512f(auVar108);
  auVar42 = ZEXT816(0x3f80000000000000);
  auVar102._32_32_ = auVar108._32_32_;
  auVar45 = auVar42;
LAB_01a6bc08:
  auVar245 = ZEXT3264(local_460);
  auVar243 = ZEXT3264(local_440);
  auVar52 = vshufps_avx(auVar45,auVar45,0x50);
  auVar229._8_4_ = 0x3f800000;
  auVar229._0_8_ = 0x3f8000003f800000;
  auVar229._12_4_ = 0x3f800000;
  auVar232._16_4_ = 0x3f800000;
  auVar232._0_16_ = auVar229;
  auVar232._20_4_ = 0x3f800000;
  auVar232._24_4_ = 0x3f800000;
  auVar232._28_4_ = 0x3f800000;
  auVar50 = vsubps_avx(auVar229,auVar52);
  fVar103 = auVar52._0_4_;
  fVar109 = auVar46._0_4_;
  auVar127._0_4_ = fVar109 * fVar103;
  fVar198 = auVar52._4_4_;
  fVar110 = auVar46._4_4_;
  auVar127._4_4_ = fVar110 * fVar198;
  fVar209 = auVar52._8_4_;
  auVar127._8_4_ = fVar109 * fVar209;
  fVar211 = auVar52._12_4_;
  auVar127._12_4_ = fVar110 * fVar211;
  fVar111 = auVar47._0_4_;
  auVar135._0_4_ = fVar111 * fVar103;
  fVar120 = auVar47._4_4_;
  auVar135._4_4_ = fVar120 * fVar198;
  auVar135._8_4_ = fVar111 * fVar209;
  auVar135._12_4_ = fVar120 * fVar211;
  fVar132 = auVar48._0_4_;
  auVar148._0_4_ = fVar132 * fVar103;
  fVar133 = auVar48._4_4_;
  auVar148._4_4_ = fVar133 * fVar198;
  auVar148._8_4_ = fVar132 * fVar209;
  auVar148._12_4_ = fVar133 * fVar211;
  fVar134 = auVar5._0_4_;
  auVar114._0_4_ = fVar134 * fVar103;
  fVar197 = auVar5._4_4_;
  auVar114._4_4_ = fVar197 * fVar198;
  auVar114._8_4_ = fVar134 * fVar209;
  auVar114._12_4_ = fVar197 * fVar211;
  auVar43 = vfmadd231ps_fma(auVar127,auVar50,auVar160);
  auVar44 = vfmadd231ps_avx512vl(auVar135,auVar50,auVar54);
  auVar49 = vfmadd231ps_avx512vl(auVar148,auVar50,auVar53);
  auVar50 = vfmadd231ps_fma(auVar114,auVar179,auVar50);
  auVar52 = vmovshdup_avx(auVar42);
  fVar198 = auVar42._0_4_;
  fVar103 = (auVar52._0_4_ - fVar198) * 0.04761905;
  auVar174._4_4_ = fVar198;
  auVar174._0_4_ = fVar198;
  auVar174._8_4_ = fVar198;
  auVar174._12_4_ = fVar198;
  auVar174._16_4_ = fVar198;
  auVar174._20_4_ = fVar198;
  auVar174._24_4_ = fVar198;
  auVar174._28_4_ = fVar198;
  auVar125._0_8_ = auVar52._0_8_;
  auVar125._8_8_ = auVar125._0_8_;
  auVar125._16_8_ = auVar125._0_8_;
  auVar125._24_8_ = auVar125._0_8_;
  auVar74 = vsubps_avx(auVar125,auVar174);
  uVar112 = auVar43._0_4_;
  auVar126._4_4_ = uVar112;
  auVar126._0_4_ = uVar112;
  auVar126._8_4_ = uVar112;
  auVar126._12_4_ = uVar112;
  auVar126._16_4_ = uVar112;
  auVar126._20_4_ = uVar112;
  auVar126._24_4_ = uVar112;
  auVar126._28_4_ = uVar112;
  auVar193._8_4_ = 1;
  auVar193._0_8_ = 0x100000001;
  auVar193._12_4_ = 1;
  auVar193._16_4_ = 1;
  auVar193._20_4_ = 1;
  auVar193._24_4_ = 1;
  auVar193._28_4_ = 1;
  auVar84 = ZEXT1632(auVar43);
  auVar72 = vpermps_avx2(auVar193,auVar84);
  auVar73 = vbroadcastss_avx512vl(auVar44);
  auVar85 = ZEXT1632(auVar44);
  auVar75 = vpermps_avx512vl(auVar193,auVar85);
  auVar76 = vbroadcastss_avx512vl(auVar49);
  auVar69 = ZEXT1632(auVar49);
  auVar77 = vpermps_avx512vl(auVar193,auVar69);
  auVar78 = vbroadcastss_avx512vl(auVar50);
  auVar81 = ZEXT1632(auVar50);
  auVar79 = vpermps_avx512vl(auVar193,auVar81);
  auVar194._4_4_ = fVar103;
  auVar194._0_4_ = fVar103;
  auVar194._8_4_ = fVar103;
  auVar194._12_4_ = fVar103;
  auVar194._16_4_ = fVar103;
  auVar194._20_4_ = fVar103;
  auVar194._24_4_ = fVar103;
  auVar194._28_4_ = fVar103;
  auVar82 = auVar244._0_32_;
  auVar70 = vpermps_avx512vl(auVar82,auVar84);
  auVar167._8_4_ = 3;
  auVar167._0_8_ = 0x300000003;
  auVar167._12_4_ = 3;
  auVar167._16_4_ = 3;
  auVar167._20_4_ = 3;
  auVar167._24_4_ = 3;
  auVar167._28_4_ = 3;
  auVar71 = vpermps_avx512vl(auVar167,auVar84);
  auVar80 = vpermps_avx512vl(auVar82,auVar85);
  auVar84 = vpermps_avx2(auVar167,auVar85);
  auVar68 = vpermps_avx512vl(auVar82,auVar69);
  auVar85 = vpermps_avx2(auVar167,auVar69);
  auVar69 = vpermps_avx512vl(auVar82,auVar81);
  auVar81 = vpermps_avx512vl(auVar167,auVar81);
  auVar52 = vfmadd132ps_fma(auVar74,auVar174,_DAT_01f7b040);
  auVar74 = vsubps_avx(auVar232,ZEXT1632(auVar52));
  auVar82 = vmulps_avx512vl(auVar73,ZEXT1632(auVar52));
  auVar86 = ZEXT1632(auVar52);
  auVar83 = vmulps_avx512vl(auVar75,auVar86);
  auVar50 = vfmadd231ps_fma(auVar82,auVar74,auVar126);
  auVar43 = vfmadd231ps_fma(auVar83,auVar74,auVar72);
  auVar82 = vmulps_avx512vl(auVar76,auVar86);
  auVar83 = vmulps_avx512vl(auVar77,auVar86);
  auVar73 = vfmadd231ps_avx512vl(auVar82,auVar74,auVar73);
  auVar75 = vfmadd231ps_avx512vl(auVar83,auVar74,auVar75);
  auVar82 = vmulps_avx512vl(auVar78,auVar86);
  auVar83 = ZEXT1632(auVar52);
  auVar79 = vmulps_avx512vl(auVar79,auVar83);
  auVar76 = vfmadd231ps_avx512vl(auVar82,auVar74,auVar76);
  auVar77 = vfmadd231ps_avx512vl(auVar79,auVar74,auVar77);
  fVar209 = auVar52._0_4_;
  fVar211 = auVar52._4_4_;
  auVar20._4_4_ = fVar211 * auVar73._4_4_;
  auVar20._0_4_ = fVar209 * auVar73._0_4_;
  fVar208 = auVar52._8_4_;
  auVar20._8_4_ = fVar208 * auVar73._8_4_;
  fVar210 = auVar52._12_4_;
  auVar20._12_4_ = fVar210 * auVar73._12_4_;
  auVar20._16_4_ = auVar73._16_4_ * 0.0;
  auVar20._20_4_ = auVar73._20_4_ * 0.0;
  auVar20._24_4_ = auVar73._24_4_ * 0.0;
  auVar20._28_4_ = fVar198;
  auVar21._4_4_ = fVar211 * auVar75._4_4_;
  auVar21._0_4_ = fVar209 * auVar75._0_4_;
  auVar21._8_4_ = fVar208 * auVar75._8_4_;
  auVar21._12_4_ = fVar210 * auVar75._12_4_;
  auVar21._16_4_ = auVar75._16_4_ * 0.0;
  auVar21._20_4_ = auVar75._20_4_ * 0.0;
  auVar21._24_4_ = auVar75._24_4_ * 0.0;
  auVar21._28_4_ = auVar72._28_4_;
  auVar50 = vfmadd231ps_fma(auVar20,auVar74,ZEXT1632(auVar50));
  auVar43 = vfmadd231ps_fma(auVar21,auVar74,ZEXT1632(auVar43));
  auVar118._0_4_ = fVar209 * auVar76._0_4_;
  auVar118._4_4_ = fVar211 * auVar76._4_4_;
  auVar118._8_4_ = fVar208 * auVar76._8_4_;
  auVar118._12_4_ = fVar210 * auVar76._12_4_;
  auVar118._16_4_ = auVar76._16_4_ * 0.0;
  auVar118._20_4_ = auVar76._20_4_ * 0.0;
  auVar118._24_4_ = auVar76._24_4_ * 0.0;
  auVar118._28_4_ = 0;
  auVar22._4_4_ = fVar211 * auVar77._4_4_;
  auVar22._0_4_ = fVar209 * auVar77._0_4_;
  auVar22._8_4_ = fVar208 * auVar77._8_4_;
  auVar22._12_4_ = fVar210 * auVar77._12_4_;
  auVar22._16_4_ = auVar77._16_4_ * 0.0;
  auVar22._20_4_ = auVar77._20_4_ * 0.0;
  auVar22._24_4_ = auVar77._24_4_ * 0.0;
  auVar22._28_4_ = auVar76._28_4_;
  auVar44 = vfmadd231ps_fma(auVar118,auVar74,auVar73);
  auVar49 = vfmadd231ps_fma(auVar22,auVar74,auVar75);
  auVar23._28_4_ = auVar75._28_4_;
  auVar23._0_28_ =
       ZEXT1628(CONCAT412(fVar210 * auVar49._12_4_,
                          CONCAT48(fVar208 * auVar49._8_4_,
                                   CONCAT44(fVar211 * auVar49._4_4_,fVar209 * auVar49._0_4_))));
  auVar63 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar210 * auVar44._12_4_,
                                               CONCAT48(fVar208 * auVar44._8_4_,
                                                        CONCAT44(fVar211 * auVar44._4_4_,
                                                                 fVar209 * auVar44._0_4_)))),auVar74
                            ,ZEXT1632(auVar50));
  auVar67 = vfmadd231ps_fma(auVar23,auVar74,ZEXT1632(auVar43));
  auVar72 = vsubps_avx(ZEXT1632(auVar44),ZEXT1632(auVar50));
  auVar73 = vsubps_avx(ZEXT1632(auVar49),ZEXT1632(auVar43));
  auVar75 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar72 = vmulps_avx512vl(auVar72,auVar75);
  auVar73 = vmulps_avx512vl(auVar73,auVar75);
  auVar188._0_4_ = fVar103 * auVar72._0_4_;
  auVar188._4_4_ = fVar103 * auVar72._4_4_;
  auVar188._8_4_ = fVar103 * auVar72._8_4_;
  auVar188._12_4_ = fVar103 * auVar72._12_4_;
  auVar188._16_4_ = fVar103 * auVar72._16_4_;
  auVar188._20_4_ = fVar103 * auVar72._20_4_;
  auVar188._24_4_ = fVar103 * auVar72._24_4_;
  auVar188._28_4_ = 0;
  auVar72 = vmulps_avx512vl(auVar194,auVar73);
  auVar43 = vxorps_avx512vl(auVar78._0_16_,auVar78._0_16_);
  auVar73 = vpermt2ps_avx512vl(ZEXT1632(auVar63),_DAT_01fb9fc0,ZEXT1632(auVar43));
  auVar76 = vpermt2ps_avx512vl(ZEXT1632(auVar67),_DAT_01fb9fc0,ZEXT1632(auVar43));
  auVar119._0_4_ = auVar188._0_4_ + auVar63._0_4_;
  auVar119._4_4_ = auVar188._4_4_ + auVar63._4_4_;
  auVar119._8_4_ = auVar188._8_4_ + auVar63._8_4_;
  auVar119._12_4_ = auVar188._12_4_ + auVar63._12_4_;
  auVar119._16_4_ = auVar188._16_4_ + 0.0;
  auVar119._20_4_ = auVar188._20_4_ + 0.0;
  auVar119._24_4_ = auVar188._24_4_ + 0.0;
  auVar119._28_4_ = 0;
  auVar86 = ZEXT1632(auVar43);
  auVar77 = vpermt2ps_avx512vl(auVar188,_DAT_01fb9fc0,auVar86);
  auVar78 = vaddps_avx512vl(ZEXT1632(auVar67),auVar72);
  auVar79 = vpermt2ps_avx512vl(auVar72,_DAT_01fb9fc0,auVar86);
  auVar72 = vsubps_avx(auVar73,auVar77);
  auVar77 = vsubps_avx512vl(auVar76,auVar79);
  auVar79 = vmulps_avx512vl(auVar80,auVar83);
  auVar82 = vmulps_avx512vl(auVar84,auVar83);
  auVar79 = vfmadd231ps_avx512vl(auVar79,auVar74,auVar70);
  auVar70 = vfmadd231ps_avx512vl(auVar82,auVar74,auVar71);
  auVar71 = vmulps_avx512vl(auVar68,auVar83);
  auVar82 = vmulps_avx512vl(auVar85,auVar83);
  auVar71 = vfmadd231ps_avx512vl(auVar71,auVar74,auVar80);
  auVar84 = vfmadd231ps_avx512vl(auVar82,auVar74,auVar84);
  auVar80 = vmulps_avx512vl(auVar69,auVar83);
  auVar69 = vmulps_avx512vl(auVar81,auVar83);
  auVar50 = vfmadd231ps_fma(auVar80,auVar74,auVar68);
  auVar80 = vfmadd231ps_avx512vl(auVar69,auVar74,auVar85);
  auVar68 = vmulps_avx512vl(auVar83,auVar71);
  auVar81 = ZEXT1632(auVar52);
  auVar69 = vmulps_avx512vl(auVar81,auVar84);
  auVar79 = vfmadd231ps_avx512vl(auVar68,auVar74,auVar79);
  auVar70 = vfmadd231ps_avx512vl(auVar69,auVar74,auVar70);
  auVar80 = vmulps_avx512vl(auVar81,auVar80);
  auVar71 = vfmadd231ps_avx512vl
                      (ZEXT1632(CONCAT412(fVar210 * auVar50._12_4_,
                                          CONCAT48(fVar208 * auVar50._8_4_,
                                                   CONCAT44(fVar211 * auVar50._4_4_,
                                                            fVar209 * auVar50._0_4_)))),auVar74,
                       auVar71);
  auVar84 = vfmadd231ps_avx512vl(auVar80,auVar74,auVar84);
  auVar24._4_4_ = fVar211 * auVar71._4_4_;
  auVar24._0_4_ = fVar209 * auVar71._0_4_;
  auVar24._8_4_ = fVar208 * auVar71._8_4_;
  auVar24._12_4_ = fVar210 * auVar71._12_4_;
  auVar24._16_4_ = auVar71._16_4_ * 0.0;
  auVar24._20_4_ = auVar71._20_4_ * 0.0;
  auVar24._24_4_ = auVar71._24_4_ * 0.0;
  auVar24._28_4_ = auVar85._28_4_;
  auVar85 = vmulps_avx512vl(auVar81,auVar84);
  auVar80 = vfmadd231ps_avx512vl(auVar24,auVar74,auVar79);
  auVar85 = vfmadd231ps_avx512vl(auVar85,auVar70,auVar74);
  auVar74 = vsubps_avx512vl(auVar71,auVar79);
  auVar84 = vsubps_avx512vl(auVar84,auVar70);
  auVar74 = vmulps_avx512vl(auVar74,auVar75);
  auVar84 = vmulps_avx512vl(auVar84,auVar75);
  fVar198 = fVar103 * auVar74._0_4_;
  fVar209 = fVar103 * auVar74._4_4_;
  auVar25._4_4_ = fVar209;
  auVar25._0_4_ = fVar198;
  fVar211 = fVar103 * auVar74._8_4_;
  auVar25._8_4_ = fVar211;
  fVar208 = fVar103 * auVar74._12_4_;
  auVar25._12_4_ = fVar208;
  fVar210 = fVar103 * auVar74._16_4_;
  auVar25._16_4_ = fVar210;
  fVar212 = fVar103 * auVar74._20_4_;
  auVar25._20_4_ = fVar212;
  fVar103 = fVar103 * auVar74._24_4_;
  auVar25._24_4_ = fVar103;
  auVar25._28_4_ = auVar74._28_4_;
  auVar84 = vmulps_avx512vl(auVar194,auVar84);
  auVar75 = vpermt2ps_avx512vl(auVar80,_DAT_01fb9fc0,auVar86);
  auVar79 = vpermt2ps_avx512vl(auVar85,_DAT_01fb9fc0,auVar86);
  auVar195._0_4_ = auVar80._0_4_ + fVar198;
  auVar195._4_4_ = auVar80._4_4_ + fVar209;
  auVar195._8_4_ = auVar80._8_4_ + fVar211;
  auVar195._12_4_ = auVar80._12_4_ + fVar208;
  auVar195._16_4_ = auVar80._16_4_ + fVar210;
  auVar195._20_4_ = auVar80._20_4_ + fVar212;
  auVar195._24_4_ = auVar80._24_4_ + fVar103;
  auVar195._28_4_ = auVar80._28_4_ + auVar74._28_4_;
  auVar74 = vpermt2ps_avx512vl(auVar25,_DAT_01fb9fc0,ZEXT1632(auVar43));
  auVar70 = vaddps_avx512vl(auVar85,auVar84);
  auVar84 = vpermt2ps_avx512vl(auVar84,_DAT_01fb9fc0,ZEXT1632(auVar43));
  auVar74 = vsubps_avx(auVar75,auVar74);
  auVar84 = vsubps_avx512vl(auVar79,auVar84);
  auVar130 = ZEXT1632(auVar63);
  auVar71 = vsubps_avx512vl(auVar80,auVar130);
  auVar142 = ZEXT1632(auVar67);
  auVar68 = vsubps_avx512vl(auVar85,auVar142);
  auVar69 = vsubps_avx512vl(auVar75,auVar73);
  auVar71 = vaddps_avx512vl(auVar71,auVar69);
  auVar69 = vsubps_avx512vl(auVar79,auVar76);
  auVar68 = vaddps_avx512vl(auVar68,auVar69);
  auVar69 = vmulps_avx512vl(auVar142,auVar71);
  auVar69 = vfnmadd231ps_avx512vl(auVar69,auVar130,auVar68);
  auVar81 = vmulps_avx512vl(auVar78,auVar71);
  auVar81 = vfnmadd231ps_avx512vl(auVar81,auVar119,auVar68);
  auVar82 = vmulps_avx512vl(auVar77,auVar71);
  auVar82 = vfnmadd231ps_avx512vl(auVar82,auVar72,auVar68);
  auVar83 = vmulps_avx512vl(auVar76,auVar71);
  auVar83 = vfnmadd231ps_avx512vl(auVar83,auVar73,auVar68);
  auVar86 = vmulps_avx512vl(auVar85,auVar71);
  auVar86 = vfnmadd231ps_avx512vl(auVar86,auVar80,auVar68);
  auVar87 = vmulps_avx512vl(auVar70,auVar71);
  auVar87 = vfnmadd231ps_avx512vl(auVar87,auVar195,auVar68);
  auVar88 = vmulps_avx512vl(auVar84,auVar71);
  auVar88 = vfnmadd231ps_avx512vl(auVar88,auVar74,auVar68);
  auVar71 = vmulps_avx512vl(auVar79,auVar71);
  auVar71 = vfnmadd231ps_avx512vl(auVar71,auVar75,auVar68);
  auVar68 = vminps_avx512vl(auVar69,auVar81);
  auVar69 = vmaxps_avx512vl(auVar69,auVar81);
  auVar81 = vminps_avx512vl(auVar82,auVar83);
  auVar68 = vminps_avx512vl(auVar68,auVar81);
  auVar81 = vmaxps_avx512vl(auVar82,auVar83);
  auVar69 = vmaxps_avx512vl(auVar69,auVar81);
  auVar81 = vminps_avx512vl(auVar86,auVar87);
  auVar82 = vmaxps_avx512vl(auVar86,auVar87);
  auVar83 = vminps_avx512vl(auVar88,auVar71);
  auVar81 = vminps_avx512vl(auVar81,auVar83);
  auVar68 = vminps_avx512vl(auVar68,auVar81);
  auVar71 = vmaxps_avx512vl(auVar88,auVar71);
  auVar71 = vmaxps_avx512vl(auVar82,auVar71);
  auVar71 = vmaxps_avx512vl(auVar69,auVar71);
  uVar12 = vcmpps_avx512vl(auVar68,local_440,2);
  uVar13 = vcmpps_avx512vl(auVar71,local_460,5);
  bVar27 = (byte)uVar12 & (byte)uVar13 & 0x7f;
  if (bVar27 != 0) {
    auVar71 = vsubps_avx512vl(auVar73,auVar130);
    auVar68 = vsubps_avx512vl(auVar76,auVar142);
    auVar69 = vsubps_avx512vl(auVar75,auVar80);
    auVar71 = vaddps_avx512vl(auVar71,auVar69);
    auVar69 = vsubps_avx512vl(auVar79,auVar85);
    auVar68 = vaddps_avx512vl(auVar68,auVar69);
    auVar69 = vmulps_avx512vl(auVar142,auVar71);
    auVar69 = vfnmadd231ps_avx512vl(auVar69,auVar68,auVar130);
    auVar78 = vmulps_avx512vl(auVar78,auVar71);
    auVar78 = vfnmadd213ps_avx512vl(auVar119,auVar68,auVar78);
    auVar77 = vmulps_avx512vl(auVar77,auVar71);
    auVar77 = vfnmadd213ps_avx512vl(auVar72,auVar68,auVar77);
    auVar72 = vmulps_avx512vl(auVar76,auVar71);
    auVar76 = vfnmadd231ps_avx512vl(auVar72,auVar68,auVar73);
    auVar72 = vmulps_avx512vl(auVar85,auVar71);
    auVar85 = vfnmadd231ps_avx512vl(auVar72,auVar68,auVar80);
    auVar72 = vmulps_avx512vl(auVar70,auVar71);
    auVar70 = vfnmadd213ps_avx512vl(auVar195,auVar68,auVar72);
    auVar72 = vmulps_avx512vl(auVar84,auVar71);
    auVar80 = vfnmadd213ps_avx512vl(auVar74,auVar68,auVar72);
    auVar74 = vmulps_avx512vl(auVar79,auVar71);
    auVar75 = vfnmadd231ps_avx512vl(auVar74,auVar75,auVar68);
    auVar72 = vminps_avx(auVar69,auVar78);
    auVar74 = vmaxps_avx(auVar69,auVar78);
    auVar73 = vminps_avx(auVar77,auVar76);
    auVar73 = vminps_avx(auVar72,auVar73);
    auVar72 = vmaxps_avx(auVar77,auVar76);
    auVar74 = vmaxps_avx(auVar74,auVar72);
    auVar84 = vminps_avx(auVar85,auVar70);
    auVar72 = vmaxps_avx(auVar85,auVar70);
    auVar85 = vminps_avx(auVar80,auVar75);
    auVar84 = vminps_avx(auVar84,auVar85);
    auVar84 = vminps_avx(auVar73,auVar84);
    auVar73 = vmaxps_avx(auVar80,auVar75);
    auVar72 = vmaxps_avx(auVar72,auVar73);
    auVar74 = vmaxps_avx(auVar74,auVar72);
    uVar12 = vcmpps_avx512vl(auVar74,local_460,5);
    uVar13 = vcmpps_avx512vl(auVar84,local_440,2);
    bVar27 = bVar27 & (byte)uVar12 & (byte)uVar13;
    if (bVar27 != 0) {
      auStack_630[uVar29] = (uint)bVar27;
      uVar12 = vmovlps_avx(auVar42);
      (&uStack_420)[uVar29] = uVar12;
      uVar34 = vmovlps_avx(auVar45);
      auStack_3a0[uVar29] = uVar34;
      uVar29 = (ulong)((int)uVar29 + 1);
    }
  }
  auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar108 = ZEXT1664(auVar42);
  auVar42 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar238 = ZEXT1664(auVar42);
  auVar74 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar239 = ZEXT3264(auVar74);
  auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
  auVar240 = ZEXT1664(auVar42);
  auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar241 = ZEXT1664(auVar42);
  auVar89._32_32_ = auVar102._32_32_;
  auVar89._0_32_ = _DAT_01fb9fe0;
  auVar242 = ZEXT3264(_DAT_01fb9fe0);
LAB_01a6c0f3:
  do {
    do {
      do {
        if ((int)uVar29 == 0) {
          if (bVar37) goto LAB_01a6d047;
          uVar112 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar19._4_4_ = uVar112;
          auVar19._0_4_ = uVar112;
          auVar19._8_4_ = uVar112;
          auVar19._12_4_ = uVar112;
          auVar19._16_4_ = uVar112;
          auVar19._20_4_ = uVar112;
          auVar19._24_4_ = uVar112;
          auVar19._28_4_ = uVar112;
          uVar12 = vcmpps_avx512vl(local_3c0,auVar19,2);
          uVar35 = (ulong)((uint)uVar36 & (uint)uVar12);
          goto LAB_01a6b49d;
        }
        uVar28 = (int)uVar29 - 1;
        uVar30 = (ulong)uVar28;
        uVar7 = auStack_630[uVar30];
        auVar45._8_8_ = 0;
        auVar45._0_8_ = auStack_3a0[uVar30];
        uVar34 = 0;
        for (uVar33 = (ulong)uVar7; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x8000000000000000) {
          uVar34 = uVar34 + 1;
        }
        uVar32 = uVar7 - 1 & uVar7;
        bVar40 = uVar32 == 0;
        auStack_630[uVar30] = uVar32;
        if (bVar40) {
          uVar29 = (ulong)uVar28;
        }
        auVar104._8_8_ = 0;
        auVar104._0_8_ = uVar34;
        auVar42 = vpunpcklqdq_avx(auVar104,ZEXT416((int)uVar34 + 1));
        auVar102._32_32_ = auVar89._32_32_;
        auVar42 = vcvtqq2ps_avx512vl(auVar42);
        auVar42 = vmulps_avx512vl(auVar42,auVar240._0_16_);
        uVar112 = *(undefined4 *)((long)&uStack_420 + uVar30 * 8 + 4);
        auVar14._4_4_ = uVar112;
        auVar14._0_4_ = uVar112;
        auVar14._8_4_ = uVar112;
        auVar14._12_4_ = uVar112;
        auVar52 = vmulps_avx512vl(auVar42,auVar14);
        auVar50 = auVar241._0_16_;
        auVar42 = vsubps_avx512vl(auVar50,auVar42);
        uVar112 = *(undefined4 *)(&uStack_420 + uVar30);
        auVar15._4_4_ = uVar112;
        auVar15._0_4_ = uVar112;
        auVar15._8_4_ = uVar112;
        auVar15._12_4_ = uVar112;
        auVar42 = vfmadd231ps_avx512vl(auVar52,auVar42,auVar15);
        auVar52 = vmovshdup_avx(auVar42);
        fVar103 = auVar52._0_4_ - auVar42._0_4_;
        vucomiss_avx512f(ZEXT416((uint)fVar103));
        if (uVar7 == 0 || bVar40) goto LAB_01a6bc08;
        auVar52 = vshufps_avx(auVar45,auVar45,0x50);
        vucomiss_avx512f(ZEXT416((uint)fVar103));
        auVar49 = vsubps_avx512vl(auVar50,auVar52);
        fVar198 = auVar52._0_4_;
        auVar136._0_4_ = fVar198 * fVar109;
        fVar209 = auVar52._4_4_;
        auVar136._4_4_ = fVar209 * fVar110;
        fVar211 = auVar52._8_4_;
        auVar136._8_4_ = fVar211 * fVar109;
        fVar208 = auVar52._12_4_;
        auVar136._12_4_ = fVar208 * fVar110;
        auVar149._0_4_ = fVar198 * fVar111;
        auVar149._4_4_ = fVar209 * fVar120;
        auVar149._8_4_ = fVar211 * fVar111;
        auVar149._12_4_ = fVar208 * fVar120;
        auVar161._0_4_ = fVar198 * fVar132;
        auVar161._4_4_ = fVar209 * fVar133;
        auVar161._8_4_ = fVar211 * fVar132;
        auVar161._12_4_ = fVar208 * fVar133;
        auVar121._0_4_ = fVar198 * fVar134;
        auVar121._4_4_ = fVar209 * fVar197;
        auVar121._8_4_ = fVar211 * fVar134;
        auVar121._12_4_ = fVar208 * fVar197;
        auVar52 = vfmadd231ps_fma(auVar136,auVar49,auVar160);
        auVar43 = vfmadd231ps_fma(auVar149,auVar49,auVar54);
        auVar44 = vfmadd231ps_fma(auVar161,auVar49,auVar53);
        auVar49 = vfmadd231ps_fma(auVar121,auVar49,auVar179);
        auVar131._16_16_ = auVar52;
        auVar131._0_16_ = auVar52;
        auVar143._16_16_ = auVar43;
        auVar143._0_16_ = auVar43;
        auVar153._16_16_ = auVar44;
        auVar153._0_16_ = auVar44;
        auVar72 = vpermps_avx512vl(auVar242._0_32_,ZEXT1632(auVar42));
        auVar74 = vsubps_avx(auVar143,auVar131);
        auVar43 = vfmadd213ps_fma(auVar74,auVar72,auVar131);
        auVar74 = vsubps_avx(auVar153,auVar143);
        auVar63 = vfmadd213ps_fma(auVar74,auVar72,auVar143);
        auVar52 = vsubps_avx(auVar49,auVar44);
        auVar144._16_16_ = auVar52;
        auVar144._0_16_ = auVar52;
        auVar52 = vfmadd213ps_fma(auVar144,auVar72,auVar153);
        auVar74 = vsubps_avx(ZEXT1632(auVar63),ZEXT1632(auVar43));
        auVar43 = vfmadd213ps_fma(auVar74,auVar72,ZEXT1632(auVar43));
        auVar74 = vsubps_avx(ZEXT1632(auVar52),ZEXT1632(auVar63));
        auVar52 = vfmadd213ps_fma(auVar74,auVar72,ZEXT1632(auVar63));
        auVar74 = vsubps_avx(ZEXT1632(auVar52),ZEXT1632(auVar43));
        auVar66 = vfmadd231ps_fma(ZEXT1632(auVar43),auVar74,auVar72);
        auVar102._0_32_ = vmulps_avx512vl(auVar74,auVar239._0_32_);
        auVar89._16_48_ = auVar102._16_48_;
        auVar52 = vmulss_avx512f(ZEXT416((uint)fVar103),SUB6416(ZEXT464(0x3eaaaaab),0));
        fVar198 = auVar52._0_4_;
        auVar162._0_8_ =
             CONCAT44(auVar66._4_4_ + fVar198 * auVar102._4_4_,
                      auVar66._0_4_ + fVar198 * auVar102._0_4_);
        auVar162._8_4_ = auVar66._8_4_ + fVar198 * auVar102._8_4_;
        auVar162._12_4_ = auVar66._12_4_ + fVar198 * auVar102._12_4_;
        auVar137._0_4_ = fVar198 * auVar102._16_4_;
        auVar137._4_4_ = fVar198 * auVar102._20_4_;
        auVar137._8_4_ = fVar198 * auVar102._24_4_;
        auVar137._12_4_ = fVar198 * auVar102._28_4_;
        auVar61 = vsubps_avx((undefined1  [16])0x0,auVar137);
        auVar63 = vshufpd_avx(auVar66,auVar66,3);
        auVar67 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
        auVar52 = vsubps_avx(auVar63,auVar66);
        auVar43 = vsubps_avx(auVar67,(undefined1  [16])0x0);
        auVar180._0_4_ = auVar52._0_4_ + auVar43._0_4_;
        auVar180._4_4_ = auVar52._4_4_ + auVar43._4_4_;
        auVar180._8_4_ = auVar52._8_4_ + auVar43._8_4_;
        auVar180._12_4_ = auVar52._12_4_ + auVar43._12_4_;
        auVar52 = vshufps_avx(auVar66,auVar66,0xb1);
        auVar43 = vshufps_avx(auVar162,auVar162,0xb1);
        auVar44 = vshufps_avx(auVar61,auVar61,0xb1);
        auVar49 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
        auVar230._4_4_ = auVar180._0_4_;
        auVar230._0_4_ = auVar180._0_4_;
        auVar230._8_4_ = auVar180._0_4_;
        auVar230._12_4_ = auVar180._0_4_;
        auVar57 = vshufps_avx(auVar180,auVar180,0x55);
        fVar198 = auVar57._0_4_;
        auVar191._0_4_ = auVar52._0_4_ * fVar198;
        fVar209 = auVar57._4_4_;
        auVar191._4_4_ = auVar52._4_4_ * fVar209;
        fVar211 = auVar57._8_4_;
        auVar191._8_4_ = auVar52._8_4_ * fVar211;
        fVar208 = auVar57._12_4_;
        auVar191._12_4_ = auVar52._12_4_ * fVar208;
        auVar200._0_4_ = auVar43._0_4_ * fVar198;
        auVar200._4_4_ = auVar43._4_4_ * fVar209;
        auVar200._8_4_ = auVar43._8_4_ * fVar211;
        auVar200._12_4_ = auVar43._12_4_ * fVar208;
        auVar215._0_4_ = auVar44._0_4_ * fVar198;
        auVar215._4_4_ = auVar44._4_4_ * fVar209;
        auVar215._8_4_ = auVar44._8_4_ * fVar211;
        auVar215._12_4_ = auVar44._12_4_ * fVar208;
        auVar181._0_4_ = auVar49._0_4_ * fVar198;
        auVar181._4_4_ = auVar49._4_4_ * fVar209;
        auVar181._8_4_ = auVar49._8_4_ * fVar211;
        auVar181._12_4_ = auVar49._12_4_ * fVar208;
        auVar52 = vfmadd231ps_fma(auVar191,auVar230,auVar66);
        auVar43 = vfmadd231ps_fma(auVar200,auVar230,auVar162);
        auVar59 = vfmadd231ps_fma(auVar215,auVar230,auVar61);
        auVar60 = vfmadd231ps_fma(auVar181,(undefined1  [16])0x0,auVar230);
        auVar57 = vshufpd_avx(auVar52,auVar52,1);
        auVar58 = vshufpd_avx(auVar43,auVar43,1);
        auVar55 = vshufpd_avx512vl(auVar59,auVar59,1);
        auVar56 = vshufpd_avx512vl(auVar60,auVar60,1);
        auVar44 = vminss_avx(auVar52,auVar43);
        auVar52 = vmaxss_avx(auVar43,auVar52);
        auVar49 = vminss_avx(auVar59,auVar60);
        auVar43 = vmaxss_avx(auVar60,auVar59);
        auVar44 = vminss_avx(auVar44,auVar49);
        auVar52 = vmaxss_avx(auVar43,auVar52);
        auVar49 = vminss_avx(auVar57,auVar58);
        auVar43 = vmaxss_avx(auVar58,auVar57);
        auVar57 = vminss_avx512f(auVar55,auVar56);
        auVar58 = vmaxss_avx512f(auVar56,auVar55);
        auVar43 = vmaxss_avx(auVar58,auVar43);
        auVar89._0_16_ = vminss_avx512f(auVar49,auVar57);
        fVar209 = auVar43._0_4_;
        fVar198 = auVar52._0_4_;
        if (auVar44._0_4_ < 0.0001) {
          bVar41 = fVar209 == -0.0001;
          bVar38 = NAN(fVar209);
          if (fVar209 <= -0.0001) goto LAB_01a6c31e;
          break;
        }
LAB_01a6c31e:
        vucomiss_avx512f(auVar89._0_16_);
        bVar41 = fVar209 <= -0.0001;
        bVar39 = -0.0001 < fVar198;
        bVar38 = bVar41;
        if (!bVar41) break;
        uVar12 = vcmpps_avx512vl(auVar44,SUB6416(ZEXT464(0x38d1b717),0),5);
        uVar13 = vcmpps_avx512vl(auVar89._0_16_,SUB6416(ZEXT464(0x38d1b717),0),5);
        bVar27 = (byte)uVar12 & (byte)uVar13;
        bVar26 = (bVar27 & 1) == 0;
        bVar41 = bVar39 && bVar26;
        bVar38 = bVar39 && (bVar27 & 1) == 0;
      } while (!bVar39 || !bVar26);
      auVar58 = vxorps_avx512vl(auVar245._0_16_,auVar245._0_16_);
      auVar245 = ZEXT1664(auVar58);
      vcmpss_avx512f(auVar44,auVar58,1);
      uVar12 = vcmpss_avx512f(auVar52,auVar58,1);
      bVar39 = (bool)((byte)uVar12 & 1);
      auVar91._16_48_ = auVar89._16_48_;
      auVar91._0_16_ = auVar246._0_16_;
      auVar90._4_60_ = auVar91._4_60_;
      auVar90._0_4_ = (float)((uint)bVar39 * -0x40800000 + (uint)!bVar39 * auVar246._0_4_);
      vucomiss_avx512f(auVar90._0_16_);
      bVar38 = (bool)(!bVar41 | bVar38);
      bVar39 = bVar38 == false;
      auVar93._16_48_ = auVar89._16_48_;
      auVar93._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
      auVar92._4_60_ = auVar93._4_60_;
      auVar92._0_4_ = (uint)bVar38 * auVar58._0_4_ + (uint)!bVar38 * 0x7f800000;
      auVar57 = auVar92._0_16_;
      auVar95._16_48_ = auVar89._16_48_;
      auVar95._0_16_ = SUB6416(ZEXT464(0xff800000),0);
      auVar94._4_60_ = auVar95._4_60_;
      auVar94._0_4_ = (uint)bVar38 * auVar58._0_4_ + (uint)!bVar38 * -0x800000;
      auVar49 = auVar94._0_16_;
      auVar59 = vxorps_avx512vl(auVar243._0_16_,auVar243._0_16_);
      auVar243 = ZEXT1664(auVar59);
      uVar12 = vcmpss_avx512f(auVar89._0_16_,auVar58,1);
      bVar41 = (bool)((byte)uVar12 & 1);
      auVar97._16_48_ = auVar89._16_48_;
      auVar97._0_16_ = auVar246._0_16_;
      auVar96._4_60_ = auVar97._4_60_;
      auVar96._0_4_ = (float)((uint)bVar41 * -0x40800000 + (uint)!bVar41 * auVar246._0_4_);
      vucomiss_avx512f(auVar96._0_16_);
      if ((bVar38) || (bVar39)) {
        auVar58 = vucomiss_avx512f(auVar44);
        if ((bVar38) || (bVar39)) {
          auVar18._8_4_ = 0x80000000;
          auVar18._0_8_ = 0x8000000080000000;
          auVar18._12_4_ = 0x80000000;
          auVar60 = vxorps_avx512vl(auVar44,auVar18);
          auVar44 = vsubss_avx512f(auVar58,auVar44);
          auVar44 = vdivss_avx512f(auVar60,auVar44);
          auVar58 = vsubss_avx512f(ZEXT416(0x3f800000),auVar44);
          auVar58 = vfmadd213ss_avx512f(auVar58,auVar59,auVar44);
          auVar44 = auVar58;
        }
        else {
          auVar44 = vxorps_avx512vl(auVar58,auVar58);
          vucomiss_avx512f(auVar44);
          auVar58 = ZEXT416(0x3f800000);
          if ((bVar38) || (bVar39)) {
            auVar58 = SUB6416(ZEXT464(0xff800000),0);
            auVar44 = SUB6416(ZEXT464(0x7f800000),0);
          }
        }
        auVar57 = vminss_avx512f(auVar57,auVar44);
        auVar49 = vmaxss_avx(auVar58,auVar49);
      }
      auVar246 = ZEXT464(0x3f800000);
      uVar12 = vcmpss_avx512f(auVar43,auVar59,1);
      bVar41 = (bool)((byte)uVar12 & 1);
      auVar43 = auVar246._0_16_;
      fVar211 = (float)((uint)bVar41 * -0x40800000 + (uint)!bVar41 * 0x3f800000);
      if ((auVar90._0_4_ != fVar211) || (NAN(auVar90._0_4_) || NAN(fVar211))) {
        if ((fVar209 != fVar198) || (NAN(fVar209) || NAN(fVar198))) {
          auVar17._8_4_ = 0x80000000;
          auVar17._0_8_ = 0x8000000080000000;
          auVar17._12_4_ = 0x80000000;
          auVar52 = vxorps_avx512vl(auVar52,auVar17);
          auVar182._0_4_ = auVar52._0_4_ / (fVar209 - fVar198);
          auVar182._4_12_ = auVar52._4_12_;
          auVar52 = vsubss_avx512f(auVar43,auVar182);
          auVar52 = vfmadd213ss_avx512f(auVar52,auVar59,auVar182);
          auVar44 = auVar52;
        }
        else if ((fVar198 != 0.0) ||
                (auVar52 = auVar43, auVar44 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar198))) {
          auVar52 = SUB6416(ZEXT464(0xff800000),0);
          auVar44 = SUB6416(ZEXT464(0x7f800000),0);
        }
        auVar57 = vminss_avx(auVar57,auVar44);
        auVar49 = vmaxss_avx(auVar52,auVar49);
      }
      bVar41 = auVar96._0_4_ != fVar211;
      auVar52 = vminss_avx512f(auVar57,auVar43);
      auVar99._16_48_ = auVar89._16_48_;
      auVar99._0_16_ = auVar57;
      auVar98._4_60_ = auVar99._4_60_;
      auVar98._0_4_ = (uint)bVar41 * auVar52._0_4_ + (uint)!bVar41 * auVar57._0_4_;
      auVar52 = vmaxss_avx512f(auVar43,auVar49);
      auVar101._16_48_ = auVar89._16_48_;
      auVar101._0_16_ = auVar49;
      auVar100._4_60_ = auVar101._4_60_;
      auVar100._0_4_ = (uint)bVar41 * auVar52._0_4_ + (uint)!bVar41 * auVar49._0_4_;
      auVar52 = vmaxss_avx512f(auVar59,auVar98._0_16_);
      auVar89._0_16_ = vminss_avx512f(auVar100._0_16_,auVar43);
    } while (auVar89._0_4_ < auVar52._0_4_);
    auVar60 = vmaxss_avx512f(auVar59,ZEXT416((uint)(auVar52._0_4_ + -0.1)));
    auVar56 = vminss_avx512f(ZEXT416((uint)(auVar89._0_4_ + 0.1)),auVar43);
    auVar122._0_8_ = auVar66._0_8_;
    auVar122._8_8_ = auVar122._0_8_;
    auVar201._8_8_ = auVar162._0_8_;
    auVar201._0_8_ = auVar162._0_8_;
    auVar216._8_8_ = auVar61._0_8_;
    auVar216._0_8_ = auVar61._0_8_;
    auVar52 = vshufpd_avx(auVar162,auVar162,3);
    auVar44 = vshufpd_avx(auVar61,auVar61,3);
    auVar49 = vshufps_avx(auVar60,auVar56,0);
    auVar58 = vsubps_avx512vl(auVar50,auVar49);
    fVar198 = auVar49._0_4_;
    auVar150._0_4_ = fVar198 * auVar63._0_4_;
    fVar209 = auVar49._4_4_;
    auVar150._4_4_ = fVar209 * auVar63._4_4_;
    fVar211 = auVar49._8_4_;
    auVar150._8_4_ = fVar211 * auVar63._8_4_;
    fVar208 = auVar49._12_4_;
    auVar150._12_4_ = fVar208 * auVar63._12_4_;
    auVar163._0_4_ = fVar198 * auVar52._0_4_;
    auVar163._4_4_ = fVar209 * auVar52._4_4_;
    auVar163._8_4_ = fVar211 * auVar52._8_4_;
    auVar163._12_4_ = fVar208 * auVar52._12_4_;
    auVar233._0_4_ = auVar44._0_4_ * fVar198;
    auVar233._4_4_ = auVar44._4_4_ * fVar209;
    auVar233._8_4_ = auVar44._8_4_ * fVar211;
    auVar233._12_4_ = auVar44._12_4_ * fVar208;
    auVar138._0_4_ = fVar198 * auVar67._0_4_;
    auVar138._4_4_ = fVar209 * auVar67._4_4_;
    auVar138._8_4_ = fVar211 * auVar67._8_4_;
    auVar138._12_4_ = fVar208 * auVar67._12_4_;
    auVar63 = vfmadd231ps_fma(auVar150,auVar58,auVar122);
    auVar67 = vfmadd231ps_fma(auVar163,auVar58,auVar201);
    auVar57 = vfmadd231ps_fma(auVar233,auVar58,auVar216);
    auVar58 = vfmadd231ps_fma(auVar138,auVar58,ZEXT816(0));
    auVar44 = vsubss_avx512f(auVar43,auVar60);
    auVar52 = vmovshdup_avx(auVar45);
    auVar55 = vfmadd231ss_fma(ZEXT416((uint)(auVar52._0_4_ * auVar60._0_4_)),auVar45,auVar44);
    auVar44 = vsubss_avx512f(auVar43,auVar56);
    auVar56 = vfmadd231ss_fma(ZEXT416((uint)(auVar52._0_4_ * auVar56._0_4_)),auVar45,auVar44);
    auVar61 = vdivss_avx512f(auVar43,ZEXT416((uint)fVar103));
    auVar52 = vsubps_avx(auVar67,auVar63);
    auVar60 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar44 = vmulps_avx512vl(auVar52,auVar60);
    auVar52 = vsubps_avx(auVar57,auVar67);
    auVar49 = vmulps_avx512vl(auVar52,auVar60);
    auVar52 = vsubps_avx(auVar58,auVar57);
    auVar52 = vmulps_avx512vl(auVar52,auVar60);
    auVar45 = vminps_avx(auVar49,auVar52);
    auVar52 = vmaxps_avx(auVar49,auVar52);
    auVar45 = vminps_avx(auVar44,auVar45);
    auVar52 = vmaxps_avx(auVar44,auVar52);
    auVar44 = vshufpd_avx(auVar45,auVar45,3);
    auVar49 = vshufpd_avx(auVar52,auVar52,3);
    auVar45 = vminps_avx(auVar45,auVar44);
    auVar52 = vmaxps_avx(auVar52,auVar49);
    fVar103 = auVar61._0_4_;
    auVar183._0_4_ = auVar45._0_4_ * fVar103;
    auVar183._4_4_ = auVar45._4_4_ * fVar103;
    auVar183._8_4_ = auVar45._8_4_ * fVar103;
    auVar183._12_4_ = auVar45._12_4_ * fVar103;
    auVar170._0_4_ = fVar103 * auVar52._0_4_;
    auVar170._4_4_ = fVar103 * auVar52._4_4_;
    auVar170._8_4_ = fVar103 * auVar52._8_4_;
    auVar170._12_4_ = fVar103 * auVar52._12_4_;
    auVar61 = vdivss_avx512f(auVar43,ZEXT416((uint)(auVar56._0_4_ - auVar55._0_4_)));
    auVar52 = vshufpd_avx(auVar63,auVar63,3);
    auVar45 = vshufpd_avx(auVar67,auVar67,3);
    auVar44 = vshufpd_avx(auVar57,auVar57,3);
    auVar49 = vshufpd_avx(auVar58,auVar58,3);
    auVar52 = vsubps_avx(auVar52,auVar63);
    auVar63 = vsubps_avx(auVar45,auVar67);
    auVar67 = vsubps_avx(auVar44,auVar57);
    auVar49 = vsubps_avx(auVar49,auVar58);
    auVar45 = vminps_avx(auVar52,auVar63);
    auVar52 = vmaxps_avx(auVar52,auVar63);
    auVar44 = vminps_avx(auVar67,auVar49);
    auVar44 = vminps_avx(auVar45,auVar44);
    auVar45 = vmaxps_avx(auVar67,auVar49);
    auVar52 = vmaxps_avx(auVar52,auVar45);
    fVar103 = auVar61._0_4_;
    auVar217._0_4_ = fVar103 * auVar44._0_4_;
    auVar217._4_4_ = fVar103 * auVar44._4_4_;
    auVar217._8_4_ = fVar103 * auVar44._8_4_;
    auVar217._12_4_ = fVar103 * auVar44._12_4_;
    auVar202._0_4_ = fVar103 * auVar52._0_4_;
    auVar202._4_4_ = fVar103 * auVar52._4_4_;
    auVar202._8_4_ = fVar103 * auVar52._8_4_;
    auVar202._12_4_ = fVar103 * auVar52._12_4_;
    auVar49 = vinsertps_avx(auVar42,auVar55,0x10);
    auVar62 = vpermt2ps_avx512vl(auVar42,_DAT_01fb9f90,auVar56);
    auVar113._0_4_ = auVar49._0_4_ + auVar62._0_4_;
    auVar113._4_4_ = auVar49._4_4_ + auVar62._4_4_;
    auVar113._8_4_ = auVar49._8_4_ + auVar62._8_4_;
    auVar113._12_4_ = auVar49._12_4_ + auVar62._12_4_;
    auVar61 = vmulps_avx512vl(auVar113,auVar108._0_16_);
    auVar45 = vshufps_avx(auVar61,auVar61,0x54);
    uVar112 = auVar61._0_4_;
    auVar115._4_4_ = uVar112;
    auVar115._0_4_ = uVar112;
    auVar115._8_4_ = uVar112;
    auVar115._12_4_ = uVar112;
    auVar44 = vfmadd213ps_fma(local_470,auVar115,auVar3);
    auVar63 = vfmadd213ps_fma(local_480,auVar115,auVar51);
    auVar67 = vfmadd213ps_fma(local_490,auVar115,auVar4);
    auVar52 = vsubps_avx(auVar63,auVar44);
    auVar44 = vfmadd213ps_fma(auVar52,auVar115,auVar44);
    auVar52 = vsubps_avx(auVar67,auVar63);
    auVar52 = vfmadd213ps_fma(auVar52,auVar115,auVar63);
    auVar52 = vsubps_avx(auVar52,auVar44);
    auVar44 = vfmadd231ps_fma(auVar44,auVar52,auVar115);
    auVar57 = vmulps_avx512vl(auVar52,auVar60);
    auVar225._8_8_ = auVar44._0_8_;
    auVar225._0_8_ = auVar44._0_8_;
    auVar52 = vshufpd_avx(auVar44,auVar44,3);
    auVar44 = vshufps_avx(auVar61,auVar61,0x55);
    auVar63 = vsubps_avx(auVar52,auVar225);
    auVar67 = vfmadd231ps_fma(auVar225,auVar44,auVar63);
    auVar234._8_8_ = auVar57._0_8_;
    auVar234._0_8_ = auVar57._0_8_;
    auVar52 = vshufpd_avx(auVar57,auVar57,3);
    auVar52 = vsubps_avx512vl(auVar52,auVar234);
    auVar52 = vfmadd213ps_avx512vl(auVar52,auVar44,auVar234);
    auVar44 = vxorps_avx512vl(auVar63,auVar247._0_16_);
    auVar57 = vmovshdup_avx512vl(auVar52);
    auVar58 = vxorps_avx512vl(auVar57,auVar247._0_16_);
    auVar60 = vmovshdup_avx512vl(auVar63);
    auVar58 = vpermt2ps_avx512vl(auVar58,ZEXT416(5),auVar63);
    auVar245 = ZEXT464(0x40400000);
    auVar63 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar57._0_4_ * auVar63._0_4_)),auVar52,auVar60);
    auVar44 = vpermt2ps_avx512vl(auVar52,SUB6416(ZEXT464(4),0),auVar44);
    auVar139._0_4_ = auVar63._0_4_;
    auVar139._4_4_ = auVar139._0_4_;
    auVar139._8_4_ = auVar139._0_4_;
    auVar139._12_4_ = auVar139._0_4_;
    auVar52 = vdivps_avx(auVar58,auVar139);
    auVar64 = vdivps_avx512vl(auVar44,auVar139);
    fVar103 = auVar67._0_4_;
    auVar44 = vshufps_avx(auVar67,auVar67,0x55);
    auVar226._0_4_ = fVar103 * auVar52._0_4_ + auVar44._0_4_ * auVar64._0_4_;
    auVar226._4_4_ = fVar103 * auVar52._4_4_ + auVar44._4_4_ * auVar64._4_4_;
    auVar226._8_4_ = fVar103 * auVar52._8_4_ + auVar44._8_4_ * auVar64._8_4_;
    auVar226._12_4_ = fVar103 * auVar52._12_4_ + auVar44._12_4_ * auVar64._12_4_;
    auVar60 = vsubps_avx(auVar45,auVar226);
    auVar44 = vmovshdup_avx(auVar52);
    auVar45 = vinsertps_avx(auVar183,auVar217,0x1c);
    auVar235._0_4_ = auVar44._0_4_ * auVar45._0_4_;
    auVar235._4_4_ = auVar44._4_4_ * auVar45._4_4_;
    auVar235._8_4_ = auVar44._8_4_ * auVar45._8_4_;
    auVar235._12_4_ = auVar44._12_4_ * auVar45._12_4_;
    auVar66 = vinsertps_avx512f(auVar170,auVar202,0x1c);
    auVar44 = vmulps_avx512vl(auVar44,auVar66);
    auVar58 = vminps_avx512vl(auVar235,auVar44);
    auVar67 = vmaxps_avx(auVar44,auVar235);
    auVar57 = vmovshdup_avx(auVar64);
    auVar44 = vinsertps_avx(auVar217,auVar183,0x4c);
    auVar218._0_4_ = auVar57._0_4_ * auVar44._0_4_;
    auVar218._4_4_ = auVar57._4_4_ * auVar44._4_4_;
    auVar218._8_4_ = auVar57._8_4_ * auVar44._8_4_;
    auVar218._12_4_ = auVar57._12_4_ * auVar44._12_4_;
    auVar63 = vinsertps_avx(auVar202,auVar170,0x4c);
    auVar203._0_4_ = auVar57._0_4_ * auVar63._0_4_;
    auVar203._4_4_ = auVar57._4_4_ * auVar63._4_4_;
    auVar203._8_4_ = auVar57._8_4_ * auVar63._8_4_;
    auVar203._12_4_ = auVar57._12_4_ * auVar63._12_4_;
    auVar57 = vminps_avx(auVar218,auVar203);
    auVar58 = vaddps_avx512vl(auVar58,auVar57);
    auVar57 = vmaxps_avx(auVar203,auVar218);
    auVar204._0_4_ = auVar67._0_4_ + auVar57._0_4_;
    auVar204._4_4_ = auVar67._4_4_ + auVar57._4_4_;
    auVar204._8_4_ = auVar67._8_4_ + auVar57._8_4_;
    auVar204._12_4_ = auVar67._12_4_ + auVar57._12_4_;
    auVar219._8_8_ = 0x3f80000000000000;
    auVar219._0_8_ = 0x3f80000000000000;
    auVar67 = vsubps_avx(auVar219,auVar204);
    auVar57 = vsubps_avx(auVar219,auVar58);
    auVar58 = vsubps_avx(auVar49,auVar61);
    auVar61 = vsubps_avx(auVar62,auVar61);
    fVar208 = auVar58._0_4_;
    auVar236._0_4_ = fVar208 * auVar67._0_4_;
    fVar210 = auVar58._4_4_;
    auVar236._4_4_ = fVar210 * auVar67._4_4_;
    fVar212 = auVar58._8_4_;
    auVar236._8_4_ = fVar212 * auVar67._8_4_;
    fVar213 = auVar58._12_4_;
    auVar236._12_4_ = fVar213 * auVar67._12_4_;
    auVar65 = vbroadcastss_avx512vl(auVar52);
    auVar45 = vmulps_avx512vl(auVar65,auVar45);
    auVar66 = vmulps_avx512vl(auVar65,auVar66);
    auVar65 = vminps_avx512vl(auVar45,auVar66);
    auVar66 = vmaxps_avx512vl(auVar66,auVar45);
    auVar45 = vbroadcastss_avx512vl(auVar64);
    auVar44 = vmulps_avx512vl(auVar45,auVar44);
    auVar45 = vmulps_avx512vl(auVar45,auVar63);
    auVar63 = vminps_avx512vl(auVar44,auVar45);
    auVar63 = vaddps_avx512vl(auVar65,auVar63);
    auVar58 = vmulps_avx512vl(auVar58,auVar57);
    fVar103 = auVar61._0_4_;
    auVar205._0_4_ = fVar103 * auVar67._0_4_;
    fVar198 = auVar61._4_4_;
    auVar205._4_4_ = fVar198 * auVar67._4_4_;
    fVar209 = auVar61._8_4_;
    auVar205._8_4_ = fVar209 * auVar67._8_4_;
    fVar211 = auVar61._12_4_;
    auVar205._12_4_ = fVar211 * auVar67._12_4_;
    auVar220._0_4_ = fVar103 * auVar57._0_4_;
    auVar220._4_4_ = fVar198 * auVar57._4_4_;
    auVar220._8_4_ = fVar209 * auVar57._8_4_;
    auVar220._12_4_ = fVar211 * auVar57._12_4_;
    auVar45 = vmaxps_avx(auVar45,auVar44);
    auVar171._0_4_ = auVar66._0_4_ + auVar45._0_4_;
    auVar171._4_4_ = auVar66._4_4_ + auVar45._4_4_;
    auVar171._8_4_ = auVar66._8_4_ + auVar45._8_4_;
    auVar171._12_4_ = auVar66._12_4_ + auVar45._12_4_;
    auVar184._8_8_ = 0x3f800000;
    auVar184._0_8_ = 0x3f800000;
    auVar45 = vsubps_avx(auVar184,auVar171);
    auVar44 = vsubps_avx512vl(auVar184,auVar63);
    auVar231._0_4_ = fVar208 * auVar45._0_4_;
    auVar231._4_4_ = fVar210 * auVar45._4_4_;
    auVar231._8_4_ = fVar212 * auVar45._8_4_;
    auVar231._12_4_ = fVar213 * auVar45._12_4_;
    auVar227._0_4_ = fVar208 * auVar44._0_4_;
    auVar227._4_4_ = fVar210 * auVar44._4_4_;
    auVar227._8_4_ = fVar212 * auVar44._8_4_;
    auVar227._12_4_ = fVar213 * auVar44._12_4_;
    auVar172._0_4_ = fVar103 * auVar45._0_4_;
    auVar172._4_4_ = fVar198 * auVar45._4_4_;
    auVar172._8_4_ = fVar209 * auVar45._8_4_;
    auVar172._12_4_ = fVar211 * auVar45._12_4_;
    auVar185._0_4_ = fVar103 * auVar44._0_4_;
    auVar185._4_4_ = fVar198 * auVar44._4_4_;
    auVar185._8_4_ = fVar209 * auVar44._8_4_;
    auVar185._12_4_ = fVar211 * auVar44._12_4_;
    auVar45 = vminps_avx(auVar231,auVar227);
    auVar44 = vminps_avx512vl(auVar172,auVar185);
    auVar63 = vminps_avx512vl(auVar45,auVar44);
    auVar45 = vmaxps_avx(auVar227,auVar231);
    auVar44 = vmaxps_avx(auVar185,auVar172);
    auVar44 = vmaxps_avx(auVar44,auVar45);
    auVar67 = vminps_avx512vl(auVar236,auVar58);
    auVar45 = vminps_avx(auVar205,auVar220);
    auVar45 = vminps_avx(auVar67,auVar45);
    auVar45 = vhaddps_avx(auVar63,auVar45);
    auVar89._0_16_ = vmaxps_avx512vl(auVar58,auVar236);
    auVar63 = vmaxps_avx(auVar220,auVar205);
    auVar63 = vmaxps_avx(auVar63,auVar89._0_16_);
    auVar44 = vhaddps_avx(auVar44,auVar63);
    auVar45 = vshufps_avx(auVar45,auVar45,0xe8);
    auVar44 = vshufps_avx(auVar44,auVar44,0xe8);
    auVar173._0_4_ = auVar45._0_4_ + auVar60._0_4_;
    auVar173._4_4_ = auVar45._4_4_ + auVar60._4_4_;
    auVar173._8_4_ = auVar45._8_4_ + auVar60._8_4_;
    auVar173._12_4_ = auVar45._12_4_ + auVar60._12_4_;
    auVar186._0_4_ = auVar44._0_4_ + auVar60._0_4_;
    auVar186._4_4_ = auVar44._4_4_ + auVar60._4_4_;
    auVar186._8_4_ = auVar44._8_4_ + auVar60._8_4_;
    auVar186._12_4_ = auVar44._12_4_ + auVar60._12_4_;
    auVar45 = vmaxps_avx(auVar49,auVar173);
    auVar44 = vminps_avx(auVar186,auVar62);
    uVar34 = vcmpps_avx512vl(auVar44,auVar45,1);
  } while ((uVar34 & 3) != 0);
  uVar34 = vcmpps_avx512vl(auVar186,auVar62,1);
  uVar12 = vcmpps_avx512vl(auVar42,auVar173,1);
  if (((ushort)uVar12 & (ushort)uVar34 & 1) == 0) {
    bVar27 = 0;
  }
  else {
    auVar45 = vmovshdup_avx(auVar173);
    bVar27 = auVar55._0_4_ < auVar45._0_4_ & (byte)(uVar34 >> 1) & 0x7f;
  }
  if (((3 < (uint)uVar29 || uVar7 != 0 && !bVar40) | bVar27) != 1) goto LAB_01a6cfc5;
  lVar31 = 0xc9;
  do {
    lVar31 = lVar31 + -1;
    if (lVar31 == 0) goto LAB_01a6c0f3;
    auVar42 = vsubss_avx512f(auVar43,auVar60);
    fVar209 = auVar42._0_4_;
    fVar103 = fVar209 * fVar209 * fVar209;
    auVar42 = vmulss_avx512f(auVar60,ZEXT416(0x40400000));
    fVar198 = auVar42._0_4_ * fVar209 * fVar209;
    fVar211 = auVar60._0_4_;
    auVar42 = vmulss_avx512f(ZEXT416((uint)(fVar211 * fVar211)),ZEXT416(0x40400000));
    fVar209 = fVar209 * auVar42._0_4_;
    auVar128._4_4_ = fVar103;
    auVar128._0_4_ = fVar103;
    auVar128._8_4_ = fVar103;
    auVar128._12_4_ = fVar103;
    auVar123._4_4_ = fVar198;
    auVar123._0_4_ = fVar198;
    auVar123._8_4_ = fVar198;
    auVar123._12_4_ = fVar198;
    auVar105._4_4_ = fVar209;
    auVar105._0_4_ = fVar209;
    auVar105._8_4_ = fVar209;
    auVar105._12_4_ = fVar209;
    fVar211 = fVar211 * fVar211 * fVar211;
    auVar151._0_4_ = (float)local_4a0._0_4_ * fVar211;
    auVar151._4_4_ = (float)local_4a0._4_4_ * fVar211;
    auVar151._8_4_ = fStack_498 * fVar211;
    auVar151._12_4_ = fStack_494 * fVar211;
    auVar42 = vfmadd231ps_fma(auVar151,auVar4,auVar105);
    auVar42 = vfmadd231ps_fma(auVar42,auVar51,auVar123);
    auVar42 = vfmadd231ps_fma(auVar42,auVar3,auVar128);
    auVar106._8_8_ = auVar42._0_8_;
    auVar106._0_8_ = auVar42._0_8_;
    auVar42 = vshufpd_avx(auVar42,auVar42,3);
    auVar45 = vshufps_avx(auVar60,auVar60,0x55);
    auVar42 = vsubps_avx(auVar42,auVar106);
    auVar45 = vfmadd213ps_fma(auVar42,auVar45,auVar106);
    fVar103 = auVar45._0_4_;
    auVar42 = vshufps_avx(auVar45,auVar45,0x55);
    auVar107._0_4_ = auVar52._0_4_ * fVar103 + auVar64._0_4_ * auVar42._0_4_;
    auVar107._4_4_ = auVar52._4_4_ * fVar103 + auVar64._4_4_ * auVar42._4_4_;
    auVar107._8_4_ = auVar52._8_4_ * fVar103 + auVar64._8_4_ * auVar42._8_4_;
    auVar107._12_4_ = auVar52._12_4_ * fVar103 + auVar64._12_4_ * auVar42._12_4_;
    auVar60 = vsubps_avx(auVar60,auVar107);
    auVar42 = vandps_avx512vl(auVar45,auVar238._0_16_);
    auVar89._0_16_ = vprolq_avx512vl(auVar42,0x20);
    auVar42 = vmaxss_avx(auVar89._0_16_,auVar42);
    bVar40 = (float)local_4b0._0_4_ < auVar42._0_4_;
  } while ((float)local_4b0._0_4_ <= auVar42._0_4_);
  auVar42 = vucomiss_avx512f(auVar59);
  if (bVar40) goto LAB_01a6c0f3;
  auVar52 = vucomiss_avx512f(auVar42);
  auVar246 = ZEXT1664(auVar52);
  if (bVar40) goto LAB_01a6c0f3;
  vmovshdup_avx(auVar42);
  auVar52 = vucomiss_avx512f(auVar59);
  if (bVar40) goto LAB_01a6c0f3;
  auVar45 = vucomiss_avx512f(auVar52);
  auVar246 = ZEXT1664(auVar45);
  if (bVar40) goto LAB_01a6c0f3;
  auVar43 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                          ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
  auVar61 = vinsertps_avx(auVar43,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28);
  auVar43 = vdpps_avx(auVar61,local_4c0,0x7f);
  auVar44 = vdpps_avx(auVar61,local_4d0,0x7f);
  auVar49 = vdpps_avx(auVar61,local_4e0,0x7f);
  auVar63 = vdpps_avx(auVar61,local_4f0,0x7f);
  auVar67 = vdpps_avx(auVar61,local_500,0x7f);
  auVar57 = vdpps_avx(auVar61,local_510,0x7f);
  auVar58 = vdpps_avx(auVar61,local_520,0x7f);
  auVar61 = vdpps_avx(auVar61,local_530,0x7f);
  auVar59 = vsubss_avx512f(auVar45,auVar52);
  fVar103 = auVar52._0_4_;
  auVar52 = vfmadd231ss_fma(ZEXT416((uint)(fVar103 * auVar67._0_4_)),auVar59,auVar43);
  auVar43 = vfmadd231ss_fma(ZEXT416((uint)(auVar57._0_4_ * fVar103)),auVar59,auVar44);
  auVar44 = vfmadd231ss_fma(ZEXT416((uint)(auVar58._0_4_ * fVar103)),auVar59,auVar49);
  auVar49 = vfmadd231ss_fma(ZEXT416((uint)(fVar103 * auVar61._0_4_)),auVar59,auVar63);
  auVar45 = vsubss_avx512f(auVar45,auVar42);
  auVar152._0_4_ = auVar45._0_4_;
  fVar198 = auVar152._0_4_ * auVar152._0_4_ * auVar152._0_4_;
  auVar45 = vmulss_avx512f(auVar42,ZEXT416(0x40400000));
  fVar209 = auVar45._0_4_ * auVar152._0_4_ * auVar152._0_4_;
  fVar103 = auVar42._0_4_;
  auVar140._0_4_ = fVar103 * fVar103;
  auVar140._4_4_ = auVar42._4_4_ * auVar42._4_4_;
  auVar140._8_4_ = auVar42._8_4_ * auVar42._8_4_;
  auVar140._12_4_ = auVar42._12_4_ * auVar42._12_4_;
  auVar89._0_16_ = vmulss_avx512f(auVar140,ZEXT416(0x40400000));
  fVar211 = auVar152._0_4_ * auVar89._0_4_;
  fVar210 = fVar103 * auVar140._0_4_;
  auVar45 = vfmadd231ss_fma(ZEXT416((uint)(fVar210 * auVar49._0_4_)),ZEXT416((uint)fVar211),auVar44)
  ;
  auVar45 = vfmadd231ss_fma(auVar45,ZEXT416((uint)fVar209),auVar43);
  auVar52 = vfmadd231ss_fma(auVar45,ZEXT416((uint)fVar198),auVar52);
  fVar208 = auVar52._0_4_;
  if ((fVar208 < fVar196) || (fVar212 = *(float *)(ray + k * 4 + 0x200), fVar212 < fVar208))
  goto LAB_01a6c0f3;
  auVar52 = vshufps_avx(auVar42,auVar42,0x55);
  auVar43 = vsubps_avx512vl(auVar50,auVar52);
  fVar213 = auVar52._0_4_;
  auVar187._0_4_ = fVar213 * (float)local_550._0_4_;
  fVar221 = auVar52._4_4_;
  auVar187._4_4_ = fVar221 * (float)local_550._4_4_;
  fVar222 = auVar52._8_4_;
  auVar187._8_4_ = fVar222 * fStack_548;
  fVar223 = auVar52._12_4_;
  auVar187._12_4_ = fVar223 * fStack_544;
  auVar192._0_4_ = fVar213 * (float)local_5a0._0_4_;
  auVar192._4_4_ = fVar221 * (float)local_5a0._4_4_;
  auVar192._8_4_ = fVar222 * fStack_598;
  auVar192._12_4_ = fVar223 * fStack_594;
  auVar206._0_4_ = fVar213 * (float)local_5b0._0_4_;
  auVar206._4_4_ = fVar221 * (float)local_5b0._4_4_;
  auVar206._8_4_ = fVar222 * fStack_5a8;
  auVar206._12_4_ = fVar223 * fStack_5a4;
  auVar164._0_4_ = fVar213 * (float)local_570._0_4_;
  auVar164._4_4_ = fVar221 * (float)local_570._4_4_;
  auVar164._8_4_ = fVar222 * fStack_568;
  auVar164._12_4_ = fVar223 * fStack_564;
  auVar52 = vfmadd231ps_fma(auVar187,auVar43,local_540);
  auVar50 = vfmadd231ps_fma(auVar192,auVar43,local_580);
  auVar45 = vfmadd231ps_fma(auVar206,auVar43,local_590);
  auVar43 = vfmadd231ps_fma(auVar164,auVar43,local_560);
  auVar52 = vsubps_avx(auVar50,auVar52);
  auVar50 = vsubps_avx(auVar45,auVar50);
  auVar45 = vsubps_avx(auVar43,auVar45);
  auVar207._0_4_ = fVar103 * auVar50._0_4_;
  auVar207._4_4_ = fVar103 * auVar50._4_4_;
  auVar207._8_4_ = fVar103 * auVar50._8_4_;
  auVar207._12_4_ = fVar103 * auVar50._12_4_;
  auVar152._4_4_ = auVar152._0_4_;
  auVar152._8_4_ = auVar152._0_4_;
  auVar152._12_4_ = auVar152._0_4_;
  auVar52 = vfmadd231ps_fma(auVar207,auVar152,auVar52);
  auVar165._0_4_ = fVar103 * auVar45._0_4_;
  auVar165._4_4_ = fVar103 * auVar45._4_4_;
  auVar165._8_4_ = fVar103 * auVar45._8_4_;
  auVar165._12_4_ = fVar103 * auVar45._12_4_;
  auVar50 = vfmadd231ps_fma(auVar165,auVar152,auVar50);
  auVar166._0_4_ = fVar103 * auVar50._0_4_;
  auVar166._4_4_ = fVar103 * auVar50._4_4_;
  auVar166._8_4_ = fVar103 * auVar50._8_4_;
  auVar166._12_4_ = fVar103 * auVar50._12_4_;
  auVar52 = vfmadd231ps_fma(auVar166,auVar152,auVar52);
  auVar16._8_4_ = 0x40400000;
  auVar16._0_8_ = 0x4040000040400000;
  auVar16._12_4_ = 0x40400000;
  auVar89._0_16_ = vmulps_avx512vl(auVar52,auVar16);
  pGVar8 = (context->scene->geometries).items[uVar6].ptr;
  if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
       (bVar27 = 1, pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_01a6cfb2;
    auVar141._0_4_ = fVar210 * (float)local_5f0._0_4_;
    auVar141._4_4_ = fVar210 * (float)local_5f0._4_4_;
    auVar141._8_4_ = fVar210 * fStack_5e8;
    auVar141._12_4_ = fVar210 * fStack_5e4;
    auVar129._4_4_ = fVar211;
    auVar129._0_4_ = fVar211;
    auVar129._8_4_ = fVar211;
    auVar129._12_4_ = fVar211;
    auVar52 = vfmadd132ps_fma(auVar129,auVar141,local_5e0);
    auVar124._4_4_ = fVar209;
    auVar124._0_4_ = fVar209;
    auVar124._8_4_ = fVar209;
    auVar124._12_4_ = fVar209;
    auVar52 = vfmadd132ps_fma(auVar124,auVar52,local_5d0);
    auVar116._4_4_ = fVar198;
    auVar116._0_4_ = fVar198;
    auVar116._8_4_ = fVar198;
    auVar116._12_4_ = fVar198;
    auVar45 = vfmadd132ps_fma(auVar116,auVar52,local_5c0);
    auVar52 = vshufps_avx(auVar45,auVar45,0xc9);
    auVar50 = vshufps_avx(auVar89._0_16_,auVar89._0_16_,0xc9);
    auVar117._0_4_ = auVar45._0_4_ * auVar50._0_4_;
    auVar117._4_4_ = auVar45._4_4_ * auVar50._4_4_;
    auVar117._8_4_ = auVar45._8_4_ * auVar50._8_4_;
    auVar117._12_4_ = auVar45._12_4_ * auVar50._12_4_;
    auVar52 = vfmsub231ps_fma(auVar117,auVar89._0_16_,auVar52);
    local_200 = vbroadcastss_avx512f(auVar42);
    auVar246 = vbroadcastss_avx512f(ZEXT416(1));
    local_1c0 = vpermps_avx512f(auVar246,ZEXT1664(auVar42));
    auVar246 = vpermps_avx512f(auVar246,ZEXT1664(auVar52));
    auVar102 = vbroadcastss_avx512f(ZEXT416(2));
    local_280 = vpermps_avx512f(auVar102,ZEXT1664(auVar52));
    local_240 = vbroadcastss_avx512f(auVar52);
    local_2c0[0] = (RTCHitN)auVar246[0];
    local_2c0[1] = (RTCHitN)auVar246[1];
    local_2c0[2] = (RTCHitN)auVar246[2];
    local_2c0[3] = (RTCHitN)auVar246[3];
    local_2c0[4] = (RTCHitN)auVar246[4];
    local_2c0[5] = (RTCHitN)auVar246[5];
    local_2c0[6] = (RTCHitN)auVar246[6];
    local_2c0[7] = (RTCHitN)auVar246[7];
    local_2c0[8] = (RTCHitN)auVar246[8];
    local_2c0[9] = (RTCHitN)auVar246[9];
    local_2c0[10] = (RTCHitN)auVar246[10];
    local_2c0[0xb] = (RTCHitN)auVar246[0xb];
    local_2c0[0xc] = (RTCHitN)auVar246[0xc];
    local_2c0[0xd] = (RTCHitN)auVar246[0xd];
    local_2c0[0xe] = (RTCHitN)auVar246[0xe];
    local_2c0[0xf] = (RTCHitN)auVar246[0xf];
    local_2c0[0x10] = (RTCHitN)auVar246[0x10];
    local_2c0[0x11] = (RTCHitN)auVar246[0x11];
    local_2c0[0x12] = (RTCHitN)auVar246[0x12];
    local_2c0[0x13] = (RTCHitN)auVar246[0x13];
    local_2c0[0x14] = (RTCHitN)auVar246[0x14];
    local_2c0[0x15] = (RTCHitN)auVar246[0x15];
    local_2c0[0x16] = (RTCHitN)auVar246[0x16];
    local_2c0[0x17] = (RTCHitN)auVar246[0x17];
    local_2c0[0x18] = (RTCHitN)auVar246[0x18];
    local_2c0[0x19] = (RTCHitN)auVar246[0x19];
    local_2c0[0x1a] = (RTCHitN)auVar246[0x1a];
    local_2c0[0x1b] = (RTCHitN)auVar246[0x1b];
    local_2c0[0x1c] = (RTCHitN)auVar246[0x1c];
    local_2c0[0x1d] = (RTCHitN)auVar246[0x1d];
    local_2c0[0x1e] = (RTCHitN)auVar246[0x1e];
    local_2c0[0x1f] = (RTCHitN)auVar246[0x1f];
    local_2c0[0x20] = (RTCHitN)auVar246[0x20];
    local_2c0[0x21] = (RTCHitN)auVar246[0x21];
    local_2c0[0x22] = (RTCHitN)auVar246[0x22];
    local_2c0[0x23] = (RTCHitN)auVar246[0x23];
    local_2c0[0x24] = (RTCHitN)auVar246[0x24];
    local_2c0[0x25] = (RTCHitN)auVar246[0x25];
    local_2c0[0x26] = (RTCHitN)auVar246[0x26];
    local_2c0[0x27] = (RTCHitN)auVar246[0x27];
    local_2c0[0x28] = (RTCHitN)auVar246[0x28];
    local_2c0[0x29] = (RTCHitN)auVar246[0x29];
    local_2c0[0x2a] = (RTCHitN)auVar246[0x2a];
    local_2c0[0x2b] = (RTCHitN)auVar246[0x2b];
    local_2c0[0x2c] = (RTCHitN)auVar246[0x2c];
    local_2c0[0x2d] = (RTCHitN)auVar246[0x2d];
    local_2c0[0x2e] = (RTCHitN)auVar246[0x2e];
    local_2c0[0x2f] = (RTCHitN)auVar246[0x2f];
    local_2c0[0x30] = (RTCHitN)auVar246[0x30];
    local_2c0[0x31] = (RTCHitN)auVar246[0x31];
    local_2c0[0x32] = (RTCHitN)auVar246[0x32];
    local_2c0[0x33] = (RTCHitN)auVar246[0x33];
    local_2c0[0x34] = (RTCHitN)auVar246[0x34];
    local_2c0[0x35] = (RTCHitN)auVar246[0x35];
    local_2c0[0x36] = (RTCHitN)auVar246[0x36];
    local_2c0[0x37] = (RTCHitN)auVar246[0x37];
    local_2c0[0x38] = (RTCHitN)auVar246[0x38];
    local_2c0[0x39] = (RTCHitN)auVar246[0x39];
    local_2c0[0x3a] = (RTCHitN)auVar246[0x3a];
    local_2c0[0x3b] = (RTCHitN)auVar246[0x3b];
    local_2c0[0x3c] = (RTCHitN)auVar246[0x3c];
    local_2c0[0x3d] = (RTCHitN)auVar246[0x3d];
    local_2c0[0x3e] = (RTCHitN)auVar246[0x3e];
    local_2c0[0x3f] = (RTCHitN)auVar246[0x3f];
    local_180 = local_300._0_8_;
    uStack_178 = local_300._8_8_;
    uStack_170 = local_300._16_8_;
    uStack_168 = local_300._24_8_;
    uStack_160 = local_300._32_8_;
    uStack_158 = local_300._40_8_;
    uStack_150 = local_300._48_8_;
    uStack_148 = local_300._56_8_;
    auVar246 = vmovdqa64_avx512f(local_340);
    local_140 = vmovdqa64_avx512f(auVar246);
    vpcmpeqd_avx2(auVar246._0_32_,auVar246._0_32_);
    local_100 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
    local_c0 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
    *(float *)(ray + k * 4 + 0x200) = fVar208;
    auVar102 = vmovdqa64_avx512f(local_380);
    local_400 = vmovdqa64_avx512f(auVar102);
    local_620.valid = (int *)local_400;
    local_620.geometryUserPtr = pGVar8->userPtr;
    local_620.context = context->user;
    local_620.ray = (RTCRayN *)ray;
    local_620.hit = local_2c0;
    local_620.N = 0x10;
    if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
      (*pGVar8->occlusionFilterN)(&local_620);
      auVar242 = ZEXT3264(_DAT_01fb9fe0);
      auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar241 = ZEXT1664(auVar42);
      auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      auVar240 = ZEXT1664(auVar42);
      auVar42 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar238 = ZEXT1664(auVar42);
      auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
      auVar108 = ZEXT1664(auVar42);
      auVar42 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar247 = ZEXT1664(auVar42);
      auVar74 = vbroadcastss_avx512vl(ZEXT416(2));
      auVar244 = ZEXT3264(auVar74);
      auVar102 = vmovdqa64_avx512f(local_400);
    }
    uVar12 = vptestmd_avx512f(auVar102,auVar102);
    auVar89._32_32_ = auVar102._32_32_;
    if ((short)uVar12 == 0) {
      auVar89._0_32_ = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar239 = ZEXT3264(auVar89._0_32_);
    }
    else {
      p_Var9 = context->args->filter;
      if (p_Var9 == (RTCFilterFunctionN)0x0) {
        auVar74 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
        auVar239 = ZEXT3264(auVar74);
      }
      else {
        auVar74 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
        auVar239 = ZEXT3264(auVar74);
        if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
             RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar8->field_8).field_0x2 & 0x40) != 0)) {
          (*p_Var9)(&local_620);
          auVar242 = ZEXT3264(_DAT_01fb9fe0);
          auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar241 = ZEXT1664(auVar42);
          auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
          auVar240 = ZEXT1664(auVar42);
          auVar74 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
          auVar239 = ZEXT3264(auVar74);
          auVar42 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          auVar238 = ZEXT1664(auVar42);
          auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
          auVar108 = ZEXT1664(auVar42);
          auVar42 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
          auVar247 = ZEXT1664(auVar42);
          auVar74 = vbroadcastss_avx512vl(ZEXT416(2));
          auVar244 = ZEXT3264(auVar74);
          auVar102 = vmovdqa64_avx512f(local_400);
        }
      }
      auVar246 = ZEXT464(0x3f800000);
      uVar34 = vptestmd_avx512f(auVar102,auVar102);
      auVar102 = vbroadcastss_avx512f(ZEXT416(0xff800000));
      bVar40 = (bool)((byte)uVar34 & 1);
      auVar89._0_4_ =
           (uint)bVar40 * auVar102._0_4_ | (uint)!bVar40 * *(int *)(local_620.ray + 0x200);
      bVar40 = (bool)((byte)(uVar34 >> 1) & 1);
      auVar89._4_4_ =
           (uint)bVar40 * auVar102._4_4_ | (uint)!bVar40 * *(int *)(local_620.ray + 0x204);
      bVar40 = (bool)((byte)(uVar34 >> 2) & 1);
      auVar89._8_4_ =
           (uint)bVar40 * auVar102._8_4_ | (uint)!bVar40 * *(int *)(local_620.ray + 0x208);
      bVar40 = (bool)((byte)(uVar34 >> 3) & 1);
      auVar89._12_4_ =
           (uint)bVar40 * auVar102._12_4_ | (uint)!bVar40 * *(int *)(local_620.ray + 0x20c);
      bVar40 = (bool)((byte)(uVar34 >> 4) & 1);
      auVar89._16_4_ =
           (uint)bVar40 * auVar102._16_4_ | (uint)!bVar40 * *(int *)(local_620.ray + 0x210);
      bVar40 = (bool)((byte)(uVar34 >> 5) & 1);
      auVar89._20_4_ =
           (uint)bVar40 * auVar102._20_4_ | (uint)!bVar40 * *(int *)(local_620.ray + 0x214);
      bVar40 = (bool)((byte)(uVar34 >> 6) & 1);
      auVar89._24_4_ =
           (uint)bVar40 * auVar102._24_4_ | (uint)!bVar40 * *(int *)(local_620.ray + 0x218);
      bVar40 = (bool)((byte)(uVar34 >> 7) & 1);
      auVar89._28_4_ =
           (uint)bVar40 * auVar102._28_4_ | (uint)!bVar40 * *(int *)(local_620.ray + 0x21c);
      bVar40 = (bool)((byte)(uVar34 >> 8) & 1);
      auVar89._32_4_ =
           (uint)bVar40 * auVar102._32_4_ | (uint)!bVar40 * *(int *)(local_620.ray + 0x220);
      bVar40 = (bool)((byte)(uVar34 >> 9) & 1);
      auVar89._36_4_ =
           (uint)bVar40 * auVar102._36_4_ | (uint)!bVar40 * *(int *)(local_620.ray + 0x224);
      bVar40 = (bool)((byte)(uVar34 >> 10) & 1);
      auVar89._40_4_ =
           (uint)bVar40 * auVar102._40_4_ | (uint)!bVar40 * *(int *)(local_620.ray + 0x228);
      bVar40 = (bool)((byte)(uVar34 >> 0xb) & 1);
      auVar89._44_4_ =
           (uint)bVar40 * auVar102._44_4_ | (uint)!bVar40 * *(int *)(local_620.ray + 0x22c);
      bVar40 = (bool)((byte)(uVar34 >> 0xc) & 1);
      auVar89._48_4_ =
           (uint)bVar40 * auVar102._48_4_ | (uint)!bVar40 * *(int *)(local_620.ray + 0x230);
      bVar40 = (bool)((byte)(uVar34 >> 0xd) & 1);
      auVar89._52_4_ =
           (uint)bVar40 * auVar102._52_4_ | (uint)!bVar40 * *(int *)(local_620.ray + 0x234);
      bVar40 = (bool)((byte)(uVar34 >> 0xe) & 1);
      auVar89._56_4_ =
           (uint)bVar40 * auVar102._56_4_ | (uint)!bVar40 * *(int *)(local_620.ray + 0x238);
      bVar40 = SUB81(uVar34 >> 0xf,0);
      auVar89._60_4_ =
           (uint)bVar40 * auVar102._60_4_ | (uint)!bVar40 * *(int *)(local_620.ray + 0x23c);
      *(undefined1 (*) [64])(local_620.ray + 0x200) = auVar89;
      bVar27 = 1;
      if ((short)uVar34 != 0) goto LAB_01a6cfb2;
    }
    auVar246 = ZEXT464(0x3f800000);
    *(float *)(ray + k * 4 + 0x200) = fVar212;
  }
  bVar27 = 0;
LAB_01a6cfb2:
  bVar37 = (bool)(bVar37 | bVar27);
  goto LAB_01a6c0f3;
LAB_01a6cfc5:
  auVar45 = vinsertps_avx(auVar55,auVar56,0x10);
  goto LAB_01a6bc08;
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }